

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O0

void aom_lpf_horizontal_6_sse2(uchar *s,int p,uchar *_blimit,uchar *_limit,uchar *_thresh)

{
  undefined4 uVar1;
  undefined6 uVar2;
  undefined8 uVar3;
  undefined4 uVar4;
  undefined6 uVar5;
  undefined4 uVar6;
  undefined6 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined4 uVar18;
  undefined6 uVar19;
  undefined8 uVar20;
  undefined4 uVar21;
  undefined6 uVar22;
  undefined8 uVar23;
  undefined4 uVar24;
  undefined6 uVar25;
  undefined8 uVar26;
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  ulong *puVar44;
  ulong *puVar45;
  undefined8 uVar46;
  undefined8 *in_RCX;
  ulong uVar47;
  undefined8 *in_RDX;
  longlong extraout_RDX_00;
  longlong extraout_RDX_01;
  ulong in_RSI;
  void *in_RDI;
  void *a;
  undefined8 *in_R8;
  short sVar48;
  short sVar49;
  ushort uVar50;
  ushort uVar51;
  ushort uVar52;
  short sVar58;
  ushort uVar59;
  ushort uVar60;
  ushort uVar61;
  short sVar62;
  ushort uVar63;
  ushort uVar64;
  ushort uVar65;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qa_01;
  undefined8 extraout_XMM0_Qa_02;
  undefined8 extraout_XMM0_Qa_03;
  undefined8 extraout_XMM0_Qa_04;
  undefined8 extraout_XMM0_Qa_05;
  undefined8 extraout_XMM0_Qa_06;
  ulong uVar54;
  undefined8 extraout_XMM0_Qa_07;
  undefined8 extraout_XMM0_Qa_08;
  short sVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  undefined8 extraout_XMM0_Qb;
  ulong extraout_XMM0_Qb_00;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  ulong uVar53;
  ulong uVar70;
  undefined1 auVar57 [16];
  ulong uVar71;
  undefined8 extraout_XMM0_Qb_01;
  undefined8 extraout_XMM0_Qb_02;
  __m128i alVar72;
  __m128i b;
  __m128i b_00;
  __m128i b_01;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i v;
  __m128i v_00;
  __m128i v_01;
  __m128i v_02;
  __m128i thresh;
  __m128i limit;
  __m128i blimit;
  __m128i q1q0;
  __m128i p1p0;
  __m128i q2;
  __m128i q1;
  __m128i q0;
  __m128i p0;
  __m128i p1;
  __m128i p2;
  __m128i pq1_pq2;
  __m128i pq0x2_pq1;
  __m128i workp_c;
  __m128i workp_b;
  __m128i workp_a;
  __m128i four;
  __m128i work;
  __m128i abs_p1p0;
  __m128i abs_q1q0;
  __m128i abs_p0q0;
  __m128i abs_p1q1;
  __m128i ff;
  __m128i fe;
  __m128i one;
  __m128i qs1qs0;
  __m128i ps1ps0;
  __m128i q0_16;
  __m128i pq0_16;
  __m128i pq1_16;
  __m128i q2_16;
  __m128i pq2_16;
  __m128i flat_q0q1;
  __m128i flat_p1p0;
  __m128i q0p0;
  __m128i q1p1;
  __m128i q2p2;
  __m128i flat;
  __m128i hev;
  __m128i mask;
  __m128i zero;
  __m128i ff_1;
  __m128i t80;
  __m128i t3t4;
  __m128i hev1;
  __m128i qs1qs0_work;
  __m128i ps1ps0_work;
  __m128i work_1;
  __m128i filter2filter1;
  __m128i filter;
  undefined1 local_fe8 [16];
  undefined1 local_fd8 [16];
  undefined1 local_fc8 [16];
  undefined4 local_fb8;
  undefined4 uStack_fb4;
  undefined4 uStack_fb0;
  undefined4 uStack_fac;
  undefined4 local_fa8;
  undefined4 uStack_fa4;
  undefined4 uStack_fa0;
  undefined4 uStack_f9c;
  undefined1 local_f98 [16];
  undefined8 local_f88 [2];
  undefined8 local_f78 [2];
  undefined8 local_f68 [2];
  undefined8 local_f58 [2];
  undefined8 local_f48 [5];
  int local_f1c;
  void *local_f18;
  short local_ef8;
  short sStack_ef6;
  short sStack_ef4;
  short sStack_ef2;
  short sStack_ef0;
  short sStack_eee;
  short sStack_eec;
  short sStack_eea;
  short local_ee8;
  short sStack_ee6;
  short sStack_ee4;
  short sStack_ee2;
  short sStack_ee0;
  short sStack_ede;
  short sStack_edc;
  short sStack_eda;
  undefined8 local_ed8;
  undefined8 uStack_ed0;
  undefined8 local_ec8;
  undefined8 uStack_ec0;
  undefined8 local_eb8;
  undefined8 uStack_eb0;
  undefined8 local_ea8;
  undefined8 uStack_ea0;
  undefined8 local_e88;
  undefined8 uStack_e80;
  undefined1 local_e78 [16];
  undefined1 local_e68 [16];
  undefined1 local_e58 [16];
  undefined1 local_e48;
  undefined1 uStack_e47;
  undefined1 uStack_e46;
  undefined1 uStack_e45;
  undefined1 uStack_e44;
  undefined1 uStack_e43;
  undefined1 uStack_e42;
  undefined1 uStack_e41;
  undefined1 uStack_e40;
  undefined1 uStack_e3f;
  undefined1 uStack_e3e;
  undefined1 uStack_e3d;
  undefined1 uStack_e3c;
  undefined1 uStack_e3b;
  undefined1 uStack_e3a;
  undefined1 uStack_e39;
  ulong local_e38;
  ulong uStack_e30;
  undefined8 local_e28;
  undefined8 uStack_e20;
  ulong local_e18;
  ulong uStack_e10;
  uint local_e08;
  uint uStack_e04;
  uint uStack_e00;
  uint uStack_dfc;
  undefined8 local_df8;
  undefined8 uStack_df0;
  undefined1 local_de8;
  char cStack_de7;
  undefined1 uStack_de6;
  char cStack_de5;
  undefined1 uStack_de4;
  char cStack_de3;
  undefined1 uStack_de2;
  char cStack_de1;
  undefined1 uStack_de0;
  char cStack_ddf;
  undefined1 uStack_dde;
  char cStack_ddd;
  undefined1 uStack_ddc;
  char cStack_ddb;
  undefined1 uStack_dda;
  char cStack_dd9;
  undefined1 local_dd8;
  char cStack_dd7;
  undefined1 uStack_dd6;
  char cStack_dd5;
  undefined1 uStack_dd4;
  char cStack_dd3;
  undefined1 uStack_dd2;
  char cStack_dd1;
  undefined1 uStack_dd0;
  char cStack_dcf;
  undefined1 uStack_dce;
  char cStack_dcd;
  undefined1 uStack_dcc;
  char cStack_dcb;
  undefined1 uStack_dca;
  char cStack_dc9;
  undefined8 local_dc8;
  undefined8 uStack_dc0;
  undefined1 local_db8;
  char cStack_db7;
  undefined1 uStack_db6;
  char cStack_db5;
  undefined1 uStack_db4;
  char cStack_db3;
  undefined1 uStack_db2;
  char cStack_db1;
  undefined1 uStack_db0;
  char cStack_daf;
  undefined1 uStack_dae;
  char cStack_dad;
  undefined1 uStack_dac;
  char cStack_dab;
  undefined1 uStack_daa;
  char cStack_da9;
  char local_da8;
  char cStack_da7;
  char cStack_da6;
  char cStack_da5;
  char cStack_da4;
  char cStack_da3;
  char cStack_da2;
  char cStack_da1;
  char cStack_da0;
  char cStack_d9f;
  char cStack_d9e;
  char cStack_d9d;
  char cStack_d9c;
  char cStack_d9b;
  char cStack_d9a;
  char cStack_d99;
  char local_d98;
  char cStack_d97;
  char cStack_d96;
  char cStack_d95;
  char cStack_d94;
  char cStack_d93;
  char cStack_d92;
  char cStack_d91;
  char cStack_d90;
  char cStack_d8f;
  char cStack_d8e;
  char cStack_d8d;
  char cStack_d8c;
  char cStack_d8b;
  char cStack_d8a;
  char cStack_d89;
  undefined4 local_d88;
  undefined4 uStack_d84;
  undefined4 uStack_d80;
  undefined4 uStack_d7c;
  undefined4 local_d78;
  undefined4 uStack_d74;
  undefined4 uStack_d70;
  undefined4 uStack_d6c;
  undefined4 local_d68;
  undefined4 uStack_d64;
  undefined4 uStack_d60;
  undefined4 uStack_d5c;
  undefined1 local_d58 [16];
  undefined8 local_d48;
  undefined8 uStack_d40;
  undefined1 local_d38 [16];
  undefined8 local_d28;
  undefined8 uStack_d20;
  undefined1 (*local_d10) [16];
  undefined1 (*local_d08) [16];
  undefined1 (*local_d00) [16];
  ulong *local_cf8;
  ulong *local_cf0;
  undefined8 *local_ce8;
  undefined8 *local_ce0;
  undefined8 *local_cd8;
  undefined8 *local_cd0;
  undefined1 *local_cc8;
  undefined8 *local_cc0;
  undefined8 local_cb8;
  undefined8 uStack_cb0;
  ulong local_ca8;
  ulong uStack_ca0;
  undefined8 local_c98;
  ulong uStack_c90;
  undefined8 local_c88;
  undefined8 uStack_c80;
  undefined8 local_c78;
  undefined8 uStack_c70;
  ulong local_c68;
  ulong uStack_c60;
  undefined8 local_c58;
  ulong uStack_c50;
  undefined4 local_c08;
  undefined4 uStack_c04;
  undefined4 local_bf8;
  undefined4 uStack_bf4;
  undefined4 local_be8;
  undefined4 uStack_be4;
  undefined4 local_bd8;
  undefined4 uStack_bd4;
  undefined4 local_bc8;
  undefined4 uStack_bc4;
  undefined4 local_bb8;
  undefined4 uStack_bb4;
  undefined8 local_ba8;
  undefined8 uStack_ba0;
  undefined8 local_b98;
  undefined8 uStack_b90;
  undefined8 local_b88;
  undefined8 uStack_b80;
  undefined8 local_b78;
  undefined8 uStack_b70;
  undefined8 local_b68;
  undefined8 uStack_b60;
  undefined8 local_b58;
  undefined8 uStack_b50;
  undefined8 local_b48;
  undefined8 uStack_b40;
  undefined8 local_b38;
  undefined8 uStack_b30;
  undefined8 local_b28;
  undefined8 uStack_b20;
  undefined8 local_b18;
  undefined8 uStack_b10;
  ulong local_b08;
  undefined8 uStack_b00;
  ulong local_af8;
  undefined8 uStack_af0;
  undefined1 local_ada;
  undefined1 local_ad9;
  undefined8 local_ad8;
  undefined8 uStack_ad0;
  undefined8 local_ac8;
  ulong uStack_ac0;
  undefined8 local_ab8;
  undefined8 uStack_ab0;
  undefined8 local_aa8;
  undefined8 uStack_aa0;
  undefined8 local_a98;
  undefined8 uStack_a90;
  undefined8 local_a88;
  undefined8 uStack_a80;
  undefined8 local_a78;
  undefined8 uStack_a70;
  undefined8 local_a68;
  undefined8 uStack_a60;
  undefined8 local_a58;
  undefined8 uStack_a50;
  undefined8 local_a48;
  undefined8 uStack_a40;
  ulong local_a38;
  ulong uStack_a30;
  ulong local_a28;
  ulong uStack_a20;
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined8 local_9f8;
  undefined8 uStack_9f0;
  byte local_9e8;
  byte bStack_9e7;
  byte bStack_9e6;
  byte bStack_9e5;
  byte bStack_9e4;
  byte bStack_9e3;
  byte bStack_9e2;
  byte bStack_9e1;
  byte bStack_9e0;
  byte bStack_9df;
  byte bStack_9de;
  byte bStack_9dd;
  byte bStack_9dc;
  byte bStack_9db;
  byte bStack_9da;
  byte bStack_9d9;
  undefined1 local_9d8 [16];
  undefined1 local_9c8 [16];
  undefined8 local_9b8;
  undefined8 uStack_9b0;
  byte local_9a8;
  byte bStack_9a7;
  byte bStack_9a6;
  byte bStack_9a5;
  byte bStack_9a4;
  byte bStack_9a3;
  byte bStack_9a2;
  byte bStack_9a1;
  byte bStack_9a0;
  byte bStack_99f;
  byte bStack_99e;
  byte bStack_99d;
  byte bStack_99c;
  byte bStack_99b;
  byte bStack_99a;
  byte bStack_999;
  undefined8 local_998;
  undefined8 uStack_990;
  undefined8 local_988;
  undefined8 uStack_980;
  undefined8 local_978;
  undefined8 uStack_970;
  undefined8 local_968;
  undefined8 uStack_960;
  undefined8 local_958;
  ulong uStack_950;
  undefined8 local_948;
  undefined8 uStack_940;
  undefined4 local_90c;
  undefined8 local_908;
  undefined8 uStack_900;
  undefined4 local_8ec;
  undefined8 local_8e8;
  undefined8 uStack_8e0;
  undefined4 local_8cc;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  ulong local_8b8;
  ulong uStack_8b0;
  ulong local_8a8;
  ulong uStack_8a0;
  ulong local_898;
  ulong uStack_890;
  ulong local_888;
  ulong uStack_880;
  ulong local_878;
  ulong uStack_870;
  ulong local_868;
  ulong uStack_860;
  ulong local_858;
  ulong uStack_850;
  ulong local_848;
  ulong uStack_840;
  undefined8 local_838;
  undefined8 uStack_830;
  undefined8 local_828;
  undefined8 uStack_820;
  undefined8 local_818;
  undefined8 uStack_810;
  undefined8 local_808;
  undefined8 uStack_800;
  undefined8 local_7f8;
  undefined8 uStack_7f0;
  undefined1 local_7e8 [16];
  undefined8 local_7d8;
  undefined8 uStack_7d0;
  undefined8 local_7c8;
  undefined8 uStack_7c0;
  ulong local_7b8;
  ulong uStack_7b0;
  char local_7a8;
  char cStack_7a7;
  char cStack_7a6;
  char cStack_7a5;
  char cStack_7a4;
  char cStack_7a3;
  char cStack_7a2;
  char cStack_7a1;
  char cStack_7a0;
  char cStack_79f;
  char cStack_79e;
  char cStack_79d;
  char cStack_79c;
  char cStack_79b;
  char cStack_79a;
  char cStack_799;
  ulong local_798;
  ulong uStack_790;
  char local_788;
  char cStack_787;
  char cStack_786;
  char cStack_785;
  char cStack_784;
  char cStack_783;
  char cStack_782;
  char cStack_781;
  char cStack_780;
  char cStack_77f;
  char cStack_77e;
  char cStack_77d;
  char cStack_77c;
  char cStack_77b;
  char cStack_77a;
  char cStack_779;
  char local_778;
  char cStack_777;
  char cStack_776;
  char cStack_775;
  char cStack_774;
  char cStack_773;
  char cStack_772;
  char cStack_771;
  char cStack_770;
  char cStack_76f;
  char cStack_76e;
  char cStack_76d;
  char cStack_76c;
  char cStack_76b;
  char cStack_76a;
  byte bStack_769;
  ulong local_768;
  ulong uStack_760;
  ulong local_758;
  ulong uStack_750;
  ulong local_748;
  ulong uStack_740;
  ulong local_738;
  ulong uStack_730;
  undefined8 local_728;
  undefined8 uStack_720;
  undefined8 local_718;
  undefined8 uStack_710;
  ulong local_708;
  ulong uStack_700;
  ulong local_6f8;
  ulong uStack_6f0;
  undefined2 local_6da;
  undefined8 local_6d8;
  undefined8 uStack_6d0;
  undefined8 local_6c8;
  undefined8 uStack_6c0;
  undefined8 local_6b8;
  undefined8 uStack_6b0;
  undefined8 local_6a8;
  undefined8 uStack_6a0;
  undefined8 local_698;
  undefined8 uStack_690;
  undefined8 local_688;
  undefined8 uStack_680;
  undefined8 local_678;
  undefined8 uStack_670;
  undefined8 local_668;
  undefined8 uStack_660;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  short local_628;
  short sStack_626;
  short sStack_624;
  short sStack_622;
  short sStack_620;
  short sStack_61e;
  short sStack_61c;
  short sStack_61a;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  undefined8 local_5f8;
  undefined8 uStack_5f0;
  short local_5e8;
  short sStack_5e6;
  short sStack_5e4;
  short sStack_5e2;
  short sStack_5e0;
  short sStack_5de;
  short sStack_5dc;
  short sStack_5da;
  undefined8 local_5d8;
  undefined8 uStack_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  undefined8 local_5b8;
  undefined8 uStack_5b0;
  undefined8 local_5a8;
  undefined8 uStack_5a0;
  undefined8 local_598;
  undefined8 uStack_590;
  short local_588;
  short sStack_586;
  short sStack_584;
  short sStack_582;
  short sStack_580;
  short sStack_57e;
  short sStack_57c;
  short sStack_57a;
  undefined8 local_578;
  undefined8 uStack_570;
  undefined8 local_568;
  undefined8 uStack_560;
  undefined8 local_558;
  undefined8 uStack_550;
  short local_548;
  short sStack_546;
  short sStack_544;
  short sStack_542;
  short sStack_540;
  short sStack_53e;
  short sStack_53c;
  short sStack_53a;
  undefined8 local_538;
  undefined8 uStack_530;
  undefined8 local_528;
  undefined8 uStack_520;
  undefined8 local_518;
  undefined8 uStack_510;
  short local_508;
  short sStack_506;
  short sStack_504;
  short sStack_502;
  short sStack_500;
  short sStack_4fe;
  short sStack_4fc;
  short sStack_4fa;
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  undefined1 local_4d8;
  undefined1 uStack_4d7;
  undefined1 uStack_4d6;
  undefined1 uStack_4d5;
  undefined1 uStack_4d4;
  undefined1 uStack_4d3;
  undefined1 uStack_4d2;
  undefined1 uStack_4d1;
  undefined1 uStack_4d0;
  undefined1 uStack_4cf;
  undefined1 uStack_4ce;
  undefined1 uStack_4cd;
  undefined1 uStack_4cc;
  undefined1 uStack_4cb;
  undefined1 uStack_4ca;
  undefined1 uStack_4c9;
  ulong local_4c8;
  ulong uStack_4c0;
  undefined8 local_4b8;
  undefined8 uStack_4b0;
  ulong local_4a8;
  undefined8 uStack_4a0;
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [16];
  undefined8 local_468;
  undefined8 uStack_460;
  undefined8 local_458;
  undefined8 uStack_450;
  ulong *local_448;
  ulong *local_440;
  undefined1 *local_438;
  undefined8 *local_430;
  ulong *local_428;
  ulong *local_420;
  undefined8 local_418;
  undefined8 uStack_410;
  undefined8 local_408;
  undefined8 uStack_400;
  ulong local_3f8;
  ulong uStack_3f0;
  undefined8 local_3e8;
  ulong uStack_3e0;
  ulong local_3d8;
  ulong uStack_3d0;
  undefined8 local_3c8;
  ulong uStack_3c0;
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  undefined8 local_3a8;
  undefined8 uStack_3a0;
  undefined8 local_398;
  undefined8 uStack_390;
  undefined8 local_388;
  undefined8 uStack_380;
  undefined1 local_369;
  ulong local_368;
  ulong uStack_360;
  ulong local_358;
  ulong uStack_350;
  ulong local_348;
  ulong uStack_340;
  ulong local_338;
  ulong uStack_330;
  ulong local_328;
  ulong uStack_320;
  undefined1 local_318 [16];
  ulong local_308;
  ulong uStack_300;
  ulong local_2f8;
  ulong uStack_2f0;
  ulong local_2e8;
  ulong uStack_2e0;
  ulong local_2d8;
  ulong uStack_2d0;
  ulong local_2c8;
  ulong uStack_2c0;
  ulong local_2b8;
  ulong uStack_2b0;
  ulong local_2a8;
  ulong uStack_2a0;
  ulong local_298;
  ulong uStack_290;
  undefined8 local_288;
  ulong uStack_280;
  ulong local_278;
  ulong uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  ulong local_1f8;
  ulong uStack_1f0;
  ulong local_1e8;
  ulong uStack_1e0;
  ulong local_1d8;
  ulong uStack_1d0;
  ulong local_1c8;
  undefined8 uStack_1c0;
  ulong local_1b8;
  ulong uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  ulong local_188;
  ulong uStack_180;
  ulong local_178;
  ulong uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  ulong local_128;
  ulong uStack_120;
  undefined1 local_118;
  undefined1 local_117;
  undefined1 local_116;
  undefined1 local_115;
  undefined1 local_114;
  undefined1 local_113;
  undefined1 local_112;
  undefined1 local_111;
  undefined1 local_110;
  undefined1 local_10f;
  undefined1 local_10e;
  undefined1 local_10d;
  undefined1 local_10c;
  undefined1 local_10b;
  undefined1 local_10a;
  undefined1 local_109;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined1 local_f8;
  undefined1 local_f7;
  undefined1 local_f6;
  undefined1 local_f5;
  undefined1 local_f4;
  undefined1 local_f3;
  undefined1 local_f2;
  undefined1 local_f1;
  undefined1 local_f0;
  undefined1 local_ef;
  undefined1 local_ee;
  undefined1 local_ed;
  undefined1 local_ec;
  undefined1 local_eb;
  undefined1 local_ea;
  undefined1 local_e9;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined1 local_d8;
  undefined1 local_d7;
  undefined1 local_d6;
  undefined1 local_d5;
  undefined1 local_d4;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  undefined1 local_d0;
  undefined1 local_cf;
  undefined1 local_ce;
  undefined1 local_cd;
  undefined1 local_cc;
  undefined1 local_cb;
  undefined1 local_ca;
  undefined1 local_c9;
  ulong local_c8;
  ulong uStack_c0;
  undefined1 local_ac;
  undefined1 local_ab;
  undefined1 local_aa;
  undefined1 local_a9;
  undefined1 local_a8;
  undefined1 local_a7;
  undefined1 local_a6;
  undefined1 local_a5;
  undefined1 local_a4;
  undefined1 local_a3;
  undefined1 local_a2;
  undefined1 local_a1;
  undefined1 local_a0;
  undefined1 local_9f;
  undefined1 local_9e;
  undefined1 local_9d;
  undefined4 local_9c;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined4 local_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined2 local_10;
  undefined2 local_e;
  undefined2 local_c;
  undefined2 local_a;
  undefined2 local_8;
  undefined2 local_6;
  undefined2 local_4;
  undefined2 local_2;
  longlong extraout_RDX;
  
  local_f1c = (int)in_RSI;
  local_fc8._0_8_ = *in_RDX;
  local_fc8._8_8_ = in_RDX[1];
  local_fd8._0_8_ = *in_RCX;
  local_fd8._8_8_ = in_RCX[1];
  local_fe8._0_8_ = *in_R8;
  local_fe8._8_8_ = in_R8[1];
  uVar47 = in_RSI & 0xffffffff;
  local_f18 = in_RDI;
  xx_loadl_32((void *)((long)in_RDI - (long)(local_f1c * 3)));
  local_f48[0] = extraout_XMM0_Qa;
  xx_loadl_32((void *)((long)local_f18 - (long)(local_f1c * 2)));
  local_f58[0] = extraout_XMM0_Qa_00;
  xx_loadl_32((void *)((long)local_f18 - (long)local_f1c));
  local_f68[0] = extraout_XMM0_Qa_01;
  xx_loadl_32(local_f18);
  local_f78[0] = extraout_XMM0_Qa_02;
  xx_loadl_32((void *)((long)local_f18 + (long)local_f1c));
  a = (void *)((long)local_f18 + (long)(local_f1c * 2));
  local_f88[0] = extraout_XMM0_Qa_03;
  alVar72 = xx_loadl_32(a);
  alVar72[0] = alVar72[1];
  local_cc0 = local_f48;
  local_cc8 = local_f98;
  local_cd0 = local_f58;
  local_cd8 = local_f88;
  local_ce0 = local_f68;
  local_ce8 = local_f78;
  local_cf0 = (ulong *)&local_fb8;
  local_cf8 = (ulong *)&local_fa8;
  local_d00 = &local_fc8;
  local_d08 = &local_fd8;
  local_d10 = &local_fe8;
  local_cb8 = 0;
  uStack_cb0 = 0;
  local_d28 = 0;
  uStack_d20 = 0;
  local_bb8 = (undefined4)local_f48[0];
  uStack_bb4 = (undefined4)((ulong)local_f48[0] >> 0x20);
  local_bc8 = (undefined4)extraout_XMM0_Qa_04;
  uStack_bc4 = (undefined4)((ulong)extraout_XMM0_Qa_04 >> 0x20);
  local_d68 = local_bb8;
  uStack_d64 = local_bc8;
  uStack_d60 = uStack_bb4;
  uStack_d5c = uStack_bc4;
  local_bd8 = (undefined4)local_f58[0];
  uStack_bd4 = (undefined4)((ulong)local_f58[0] >> 0x20);
  local_be8 = (undefined4)local_f88[0];
  uStack_be4 = (undefined4)((ulong)local_f88[0] >> 0x20);
  local_d78 = local_bd8;
  uStack_d74 = local_be8;
  uStack_d70 = uStack_bd4;
  uStack_d6c = uStack_be4;
  local_bf8 = (undefined4)local_f68[0];
  uStack_bf4 = (undefined4)((ulong)local_f68[0] >> 0x20);
  local_c08 = (undefined4)local_f78[0];
  uStack_c04 = (undefined4)((ulong)local_f78[0] >> 0x20);
  local_d88 = local_bf8;
  uStack_d84 = local_c08;
  uStack_d80 = uStack_bf4;
  uStack_d7c = uStack_c04;
  local_fa8 = local_bf8;
  uStack_fa4 = local_bd8;
  uStack_fa0 = uStack_bf4;
  uStack_f9c = uStack_bd4;
  local_fb8 = local_c08;
  uStack_fb4 = local_be8;
  uStack_fb0 = uStack_c04;
  uStack_fac = uStack_be4;
  local_ad9 = 1;
  local_c9 = 1;
  local_ca = 1;
  local_cb = 1;
  local_cc = 1;
  local_cd = 1;
  local_ce = 1;
  local_cf = 1;
  local_d0 = 1;
  local_d1 = 1;
  local_d2 = 1;
  local_d3 = 1;
  local_d4 = 1;
  local_d5 = 1;
  local_d6 = 1;
  local_d7 = 1;
  local_d8 = 1;
  local_e28 = 0x101010101010101;
  uStack_e20 = 0x101010101010101;
  local_ada = 0xfe;
  local_9d = 0xfe;
  local_9e = 0xfe;
  local_9f = 0xfe;
  local_a0 = 0xfe;
  local_a1 = 0xfe;
  local_a2 = 0xfe;
  local_a3 = 0xfe;
  local_a4 = 0xfe;
  local_a5 = 0xfe;
  local_a6 = 0xfe;
  local_a7 = 0xfe;
  local_a8 = 0xfe;
  local_a9 = 0xfe;
  local_aa = 0xfe;
  local_ab = 0xfe;
  local_ac = 0xfe;
  local_e38 = 0xfefefefefefefefe;
  uStack_e30 = 0xfefefefefefefefe;
  local_e48 = 0xff;
  uStack_e47 = 0xff;
  uStack_e46 = 0xff;
  uStack_e45 = 0xff;
  uStack_e44 = 0xff;
  uStack_e43 = 0xff;
  uStack_e42 = 0xff;
  uStack_e41 = 0xff;
  uStack_e40 = 0xff;
  uStack_e3f = 0xff;
  uStack_e3e = 0xff;
  uStack_e3d = 0xff;
  uStack_e3c = 0xff;
  uStack_e3b = 0xff;
  uStack_e3a = 0xff;
  uStack_e39 = 0xff;
  alVar72[1] = uVar47;
  a_00[1] = in_RSI;
  a_00[0] = (longlong)a;
  local_a38 = local_e38;
  uStack_a30 = uStack_e30;
  local_a28 = local_e38;
  uStack_a20 = uStack_e30;
  local_e8 = local_e28;
  uStack_e0 = uStack_e20;
  local_c8 = local_e38;
  uStack_c0 = uStack_e30;
  alVar72 = abs_diff(a_00,alVar72);
  b[0] = alVar72[1];
  auVar55._8_8_ = extraout_XMM0_Qb;
  auVar55._0_8_ = extraout_XMM0_Qa_05;
  local_e78 = auVar55 >> 0x20;
  b[1] = uVar47;
  a_01[1] = in_RSI;
  a_01[0] = (longlong)a;
  local_e88 = extraout_XMM0_Qa_05;
  uStack_e80 = extraout_XMM0_Qb;
  alVar72 = abs_diff(a_01,b);
  b_00[0] = alVar72[1];
  local_e68._8_8_ = extraout_XMM0_Qb_00;
  local_e68._0_8_ = extraout_XMM0_Qa_06;
  local_968 = local_e88;
  uVar15 = local_968;
  uStack_960 = uStack_e80;
  uVar16 = uStack_960;
  local_978 = local_e78._0_8_;
  uVar13 = local_978;
  uStack_970 = local_e78._8_8_;
  uVar14 = uStack_970;
  local_968._0_1_ = (byte)local_e88;
  local_968._1_1_ = (byte)((ulong)local_e88 >> 8);
  local_968._2_1_ = (byte)((ulong)local_e88 >> 0x10);
  local_968._3_1_ = (byte)((ulong)local_e88 >> 0x18);
  local_968._4_1_ = (byte)((ulong)local_e88 >> 0x20);
  local_968._5_1_ = (byte)((ulong)local_e88 >> 0x28);
  local_968._6_1_ = (byte)((ulong)local_e88 >> 0x30);
  local_968._7_1_ = (byte)((ulong)local_e88 >> 0x38);
  uStack_960._0_1_ = (byte)uStack_e80;
  uStack_960._1_1_ = (byte)((ulong)uStack_e80 >> 8);
  uStack_960._2_1_ = (byte)((ulong)uStack_e80 >> 0x10);
  uStack_960._3_1_ = (byte)((ulong)uStack_e80 >> 0x18);
  uStack_960._4_1_ = (byte)((ulong)uStack_e80 >> 0x20);
  uStack_960._5_1_ = (byte)((ulong)uStack_e80 >> 0x28);
  uStack_960._6_1_ = (byte)((ulong)uStack_e80 >> 0x30);
  uStack_960._7_1_ = (byte)((ulong)uStack_e80 >> 0x38);
  local_978._0_1_ = local_e78[0];
  local_978._1_1_ = local_e78[1];
  local_978._2_1_ = local_e78[2];
  local_978._3_1_ = local_e78[3];
  local_978._4_1_ = local_e78[4];
  local_978._5_1_ = local_e78[5];
  local_978._6_1_ = local_e78[6];
  local_978._7_1_ = local_e78[7];
  uStack_970._0_1_ = local_e78[8];
  uStack_970._1_1_ = local_e78[9];
  uStack_970._2_1_ = local_e78[10];
  uStack_970._3_1_ = local_e78[0xb];
  uStack_970._4_1_ = local_e78[0xc];
  uStack_970._5_1_ = local_e78[0xd];
  uStack_970._6_1_ = local_e78[0xe];
  uStack_970._7_1_ = local_e78[0xf];
  local_d58[1] = (local_968._1_1_ < local_978._1_1_) * local_978._1_1_ |
                 (local_968._1_1_ >= local_978._1_1_) * local_968._1_1_;
  local_d58[0] = ((byte)local_968 < (byte)local_978) * (byte)local_978 |
                 ((byte)local_968 >= (byte)local_978) * (byte)local_968;
  local_d58[2] = (local_968._2_1_ < local_978._2_1_) * local_978._2_1_ |
                 (local_968._2_1_ >= local_978._2_1_) * local_968._2_1_;
  local_d58[3] = (local_968._3_1_ < local_978._3_1_) * local_978._3_1_ |
                 (local_968._3_1_ >= local_978._3_1_) * local_968._3_1_;
  local_d58[4] = (local_968._4_1_ < local_978._4_1_) * local_978._4_1_ |
                 (local_968._4_1_ >= local_978._4_1_) * local_968._4_1_;
  local_d58[5] = (local_968._5_1_ < local_978._5_1_) * local_978._5_1_ |
                 (local_968._5_1_ >= local_978._5_1_) * local_968._5_1_;
  local_d58[6] = (local_968._6_1_ < local_978._6_1_) * local_978._6_1_ |
                 (local_968._6_1_ >= local_978._6_1_) * local_968._6_1_;
  local_d58[7] = (local_968._7_1_ < local_978._7_1_) * local_978._7_1_ |
                 (local_968._7_1_ >= local_978._7_1_) * local_968._7_1_;
  local_d58[8] = ((byte)uStack_960 < (byte)uStack_970) * (byte)uStack_970 |
                 ((byte)uStack_960 >= (byte)uStack_970) * (byte)uStack_960;
  local_d58[9] = (uStack_960._1_1_ < uStack_970._1_1_) * uStack_970._1_1_ |
                 (uStack_960._1_1_ >= uStack_970._1_1_) * uStack_960._1_1_;
  local_d58[10] =
       (uStack_960._2_1_ < uStack_970._2_1_) * uStack_970._2_1_ |
       (uStack_960._2_1_ >= uStack_970._2_1_) * uStack_960._2_1_;
  local_d58[0xb] =
       (uStack_960._3_1_ < uStack_970._3_1_) * uStack_970._3_1_ |
       (uStack_960._3_1_ >= uStack_970._3_1_) * uStack_960._3_1_;
  local_d58[0xc] =
       (uStack_960._4_1_ < uStack_970._4_1_) * uStack_970._4_1_ |
       (uStack_960._4_1_ >= uStack_970._4_1_) * uStack_960._4_1_;
  local_d58[0xd] =
       (uStack_960._5_1_ < uStack_970._5_1_) * uStack_970._5_1_ |
       (uStack_960._5_1_ >= uStack_970._5_1_) * uStack_960._5_1_;
  local_d58[0xe] =
       (uStack_960._6_1_ < uStack_970._6_1_) * uStack_970._6_1_ |
       (uStack_960._6_1_ >= uStack_970._6_1_) * uStack_960._6_1_;
  local_d58[0xf] =
       (uStack_960._7_1_ < uStack_970._7_1_) * uStack_970._7_1_ |
       (uStack_960._7_1_ >= uStack_970._7_1_) * uStack_960._7_1_;
  local_7d8 = *(undefined8 *)*local_d10;
  uStack_7d0 = *(undefined8 *)(*local_d10 + 8);
  local_7c8 = local_d58._0_8_;
  uStack_7c0 = local_d58._8_8_;
  auVar31._8_8_ = local_d58._8_8_;
  auVar31._0_8_ = local_d58._0_8_;
  auVar55 = psubusb(auVar31,*local_d10);
  local_d48 = auVar55._0_8_;
  uStack_d40 = auVar55._8_8_;
  local_a48 = local_d48;
  uVar11 = local_a48;
  uStack_a40 = uStack_d40;
  uVar12 = uStack_a40;
  local_a58 = local_d28;
  uVar46 = local_a58;
  uStack_a50 = uStack_d20;
  uVar10 = uStack_a50;
  local_a48._0_1_ = auVar55[0];
  local_a48._1_1_ = auVar55[1];
  local_a48._2_1_ = auVar55[2];
  local_a48._3_1_ = auVar55[3];
  local_a48._4_1_ = auVar55[4];
  local_a48._5_1_ = auVar55[5];
  local_a48._6_1_ = auVar55[6];
  local_a48._7_1_ = auVar55[7];
  uStack_a40._0_1_ = auVar55[8];
  uStack_a40._1_1_ = auVar55[9];
  uStack_a40._2_1_ = auVar55[10];
  uStack_a40._3_1_ = auVar55[0xb];
  uStack_a40._4_1_ = auVar55[0xc];
  uStack_a40._5_1_ = auVar55[0xd];
  uStack_a40._6_1_ = auVar55[0xe];
  uStack_a40._7_1_ = auVar55[0xf];
  local_a58._0_1_ = (char)local_d28;
  local_a58._1_1_ = (char)((ulong)local_d28 >> 8);
  local_a58._2_1_ = (char)((ulong)local_d28 >> 0x10);
  local_a58._3_1_ = (char)((ulong)local_d28 >> 0x18);
  local_a58._4_1_ = (char)((ulong)local_d28 >> 0x20);
  local_a58._5_1_ = (char)((ulong)local_d28 >> 0x28);
  local_a58._6_1_ = (char)((ulong)local_d28 >> 0x30);
  local_a58._7_1_ = (char)((ulong)local_d28 >> 0x38);
  uStack_a50._0_1_ = (char)uStack_d20;
  uStack_a50._1_1_ = (char)((ulong)uStack_d20 >> 8);
  uStack_a50._2_1_ = (char)((ulong)uStack_d20 >> 0x10);
  uStack_a50._3_1_ = (char)((ulong)uStack_d20 >> 0x18);
  uStack_a50._4_1_ = (char)((ulong)uStack_d20 >> 0x20);
  uStack_a50._5_1_ = (char)((ulong)uStack_d20 >> 0x28);
  uStack_a50._6_1_ = (char)((ulong)uStack_d20 >> 0x30);
  uStack_a50._7_1_ = (char)((ulong)uStack_d20 >> 0x38);
  local_788 = -((char)local_a48 == (char)local_a58);
  cStack_787 = -(local_a48._1_1_ == local_a58._1_1_);
  cStack_786 = -(local_a48._2_1_ == local_a58._2_1_);
  cStack_785 = -(local_a48._3_1_ == local_a58._3_1_);
  cStack_784 = -(local_a48._4_1_ == local_a58._4_1_);
  cStack_783 = -(local_a48._5_1_ == local_a58._5_1_);
  cStack_782 = -(local_a48._6_1_ == local_a58._6_1_);
  cStack_781 = -(local_a48._7_1_ == local_a58._7_1_);
  cStack_780 = -((char)uStack_a40 == (char)uStack_a50);
  cStack_77f = -(uStack_a40._1_1_ == uStack_a50._1_1_);
  cStack_77e = -(uStack_a40._2_1_ == uStack_a50._2_1_);
  cStack_77d = -(uStack_a40._3_1_ == uStack_a50._3_1_);
  cStack_77c = -(uStack_a40._4_1_ == uStack_a50._4_1_);
  cStack_77b = -(uStack_a40._5_1_ == uStack_a50._5_1_);
  cStack_77a = -(uStack_a40._6_1_ == uStack_a50._6_1_);
  cStack_779 = -(uStack_a40._7_1_ == uStack_a50._7_1_);
  local_798 = CONCAT17(uStack_e41,
                       CONCAT16(uStack_e42,
                                CONCAT15(uStack_e43,
                                         CONCAT14(uStack_e44,
                                                  CONCAT13(uStack_e45,
                                                           CONCAT12(uStack_e46,
                                                                    CONCAT11(uStack_e47,local_e48)))
                                                 ))));
  uStack_790 = CONCAT17(uStack_e39,
                        CONCAT16(uStack_e3a,
                                 CONCAT15(uStack_e3b,
                                          CONCAT14(uStack_e3c,
                                                   CONCAT13(uStack_e3d,
                                                            CONCAT12(uStack_e3e,
                                                                     CONCAT11(uStack_e3f,uStack_e40)
                                                                    ))))));
  local_c68 = CONCAT17(cStack_781,
                       CONCAT16(cStack_782,
                                CONCAT15(cStack_783,
                                         CONCAT14(cStack_784,
                                                  CONCAT13(cStack_785,
                                                           CONCAT12(cStack_786,
                                                                    CONCAT11(cStack_787,local_788)))
                                                 )))) ^ local_798;
  uStack_c60 = CONCAT17(cStack_779,
                        CONCAT16(cStack_77a,
                                 CONCAT15(cStack_77b,
                                          CONCAT14(cStack_77c,
                                                   CONCAT13(cStack_77d,
                                                            CONCAT12(cStack_77e,
                                                                     CONCAT11(cStack_77f,cStack_780)
                                                                    )))))) ^ uStack_790;
  local_c58._0_4_ = (undefined4)local_c68;
  local_c58._4_4_ = (undefined4)(local_c68 >> 0x20);
  local_d48._4_4_ = (undefined4)local_c58;
  local_d48._0_4_ = (undefined4)local_c58;
  uStack_d40._0_4_ = local_c58._4_4_;
  uStack_d40._4_4_ = local_c58._4_4_;
  auVar27._8_8_ = extraout_XMM0_Qb_00;
  auVar27._0_8_ = extraout_XMM0_Qa_06;
  auVar56._8_8_ = extraout_XMM0_Qb_00;
  auVar56._0_8_ = extraout_XMM0_Qa_06;
  auVar56 = paddusb(auVar27,auVar56);
  local_e58._0_8_ = local_e68._4_8_;
  uStack_840 = extraout_XMM0_Qb_00 >> 0x20;
  local_848 = local_e58._0_8_;
  local_858 = local_e38;
  uStack_850 = uStack_e30;
  uVar53 = local_e58._0_8_ & local_e38;
  uVar70 = uStack_840 & uStack_e30;
  local_8cc = 1;
  local_8c8._0_2_ = (ushort)uVar53;
  local_8c8._2_2_ = (ushort)(uVar53 >> 0x10);
  local_8c8._4_2_ = (ushort)(uVar53 >> 0x20);
  uStack_8c0._0_2_ = (ushort)uVar70;
  uStack_8c0._2_2_ = (ushort)(uVar70 >> 0x10);
  local_e58._2_2_ = local_8c8._2_2_ >> 1;
  local_e58._0_2_ = (ushort)local_8c8 >> 1;
  local_e58._4_2_ = local_8c8._4_2_ >> 1;
  local_e58._6_2_ = (ushort)(uVar53 >> 0x31);
  local_e58._8_2_ = (ushort)uStack_8c0 >> 1;
  local_e58._10_2_ = uStack_8c0._2_2_ >> 1;
  local_e58._12_4_ = 0;
  auVar55 = local_e58;
  local_e68._0_8_ = auVar56._0_8_;
  local_e68._8_8_ = auVar56._8_8_;
  local_e58._12_4_ = 0;
  local_948 = local_e68._0_8_;
  uStack_940 = local_e68._8_8_;
  local_958 = local_e58._0_8_;
  uStack_950 = local_e58._8_8_;
  auVar57._8_4_ = local_e58._8_4_;
  auVar57._0_8_ = local_e58._0_8_;
  auVar57._12_4_ = 0;
  local_7e8 = paddusb(auVar56,auVar57);
  local_7f8 = *(undefined8 *)*local_d00;
  uStack_7f0 = *(undefined8 *)(*local_d00 + 8);
  auVar57 = psubusb(local_7e8,*local_d00);
  local_d38._0_8_ = auVar57._0_8_;
  local_d38._8_8_ = auVar57._8_8_;
  local_c78 = local_d38._0_8_;
  uVar3 = local_c78;
  uStack_c70 = local_d38._8_8_;
  local_c88 = local_d28;
  uStack_c80 = uStack_d20;
  local_c78._0_4_ = auVar57._0_4_;
  local_c78._4_4_ = auVar57._4_4_;
  local_c88._0_4_ = (undefined4)local_d28;
  local_c88._4_4_ = (undefined4)((ulong)local_d28 >> 0x20);
  local_d38._4_4_ = (undefined4)local_c88;
  local_d38._0_4_ = (undefined4)local_c78;
  local_d38._8_4_ = local_c78._4_4_;
  local_d38._12_4_ = local_c88._4_4_;
  local_a68 = local_d38._0_8_;
  uVar8 = local_a68;
  uStack_a60 = local_d38._8_8_;
  uVar9 = uStack_a60;
  local_a78 = local_d28;
  uStack_a70 = uStack_d20;
  local_a68._0_1_ = auVar57[0];
  local_a68._1_1_ = auVar57[1];
  local_a68._2_1_ = auVar57[2];
  local_a68._3_1_ = auVar57[3];
  uStack_a60._0_1_ = auVar57[4];
  uStack_a60._1_1_ = auVar57[5];
  uStack_a60._2_1_ = auVar57[6];
  uStack_a60._3_1_ = auVar57[7];
  local_7a8 = -((char)local_a68 == (char)local_a58);
  cStack_7a7 = -(local_a68._1_1_ == local_a58._1_1_);
  cStack_7a6 = -(local_a68._2_1_ == local_a58._2_1_);
  cStack_7a5 = -(local_a68._3_1_ == local_a58._3_1_);
  cStack_7a4 = -((char)local_a58 == local_a58._4_1_);
  cStack_7a3 = -(local_a58._1_1_ == local_a58._5_1_);
  cStack_7a2 = -(local_a58._2_1_ == local_a58._6_1_);
  cStack_7a1 = -(local_a58._3_1_ == local_a58._7_1_);
  cStack_7a0 = -((char)uStack_a60 == (char)uStack_a50);
  cStack_79f = -(uStack_a60._1_1_ == uStack_a50._1_1_);
  cStack_79e = -(uStack_a60._2_1_ == uStack_a50._2_1_);
  cStack_79d = -(uStack_a60._3_1_ == uStack_a50._3_1_);
  cStack_79c = -(local_a58._4_1_ == uStack_a50._4_1_);
  cStack_79b = -(local_a58._5_1_ == uStack_a50._5_1_);
  cStack_79a = -(local_a58._6_1_ == uStack_a50._6_1_);
  cStack_799 = -(local_a58._7_1_ == uStack_a50._7_1_);
  local_7b8 = CONCAT17(uStack_e41,
                       CONCAT16(uStack_e42,
                                CONCAT15(uStack_e43,
                                         CONCAT14(uStack_e44,
                                                  CONCAT13(uStack_e45,
                                                           CONCAT12(uStack_e46,
                                                                    CONCAT11(uStack_e47,local_e48)))
                                                 ))));
  uStack_7b0 = CONCAT17(uStack_e39,
                        CONCAT16(uStack_e3a,
                                 CONCAT15(uStack_e3b,
                                          CONCAT14(uStack_e3c,
                                                   CONCAT13(uStack_e3d,
                                                            CONCAT12(uStack_e3e,
                                                                     CONCAT11(uStack_e3f,uStack_e40)
                                                                    ))))));
  uVar54 = CONCAT17(cStack_7a1,
                    CONCAT16(cStack_7a2,
                             CONCAT15(cStack_7a3,
                                      CONCAT14(cStack_7a4,
                                               CONCAT13(cStack_7a5,
                                                        CONCAT12(cStack_7a6,
                                                                 CONCAT11(cStack_7a7,local_7a8))))))
                   ) ^ local_7b8;
  uVar71 = CONCAT17(cStack_799,
                    CONCAT16(cStack_79a,
                             CONCAT15(cStack_79b,
                                      CONCAT14(cStack_79c,
                                               CONCAT13(cStack_79d,
                                                        CONCAT12(cStack_79e,
                                                                 CONCAT11(cStack_79f,cStack_7a0)))))
                            )) ^ uStack_7b0;
  local_988 = local_e88;
  uStack_980 = uStack_e80;
  local_998._0_1_ = (byte)uVar54;
  local_998._1_1_ = (byte)(uVar54 >> 8);
  local_998._2_1_ = (byte)(uVar54 >> 0x10);
  local_998._3_1_ = (byte)(uVar54 >> 0x18);
  local_998._4_1_ = (byte)(uVar54 >> 0x20);
  local_998._5_1_ = (byte)(uVar54 >> 0x28);
  local_998._6_1_ = (byte)(uVar54 >> 0x30);
  local_998._7_1_ = (byte)(uVar54 >> 0x38);
  uStack_990._0_1_ = (byte)uVar71;
  uStack_990._1_1_ = (byte)(uVar71 >> 8);
  uStack_990._2_1_ = (byte)(uVar71 >> 0x10);
  uStack_990._3_1_ = (byte)(uVar71 >> 0x18);
  uStack_990._4_1_ = (byte)(uVar71 >> 0x20);
  uStack_990._5_1_ = (byte)(uVar71 >> 0x28);
  uStack_990._6_1_ = (byte)(uVar71 >> 0x30);
  uStack_990._7_1_ = (byte)(uVar71 >> 0x38);
  local_d38[1] = (local_968._1_1_ < local_998._1_1_) * local_998._1_1_ |
                 (local_968._1_1_ >= local_998._1_1_) * local_968._1_1_;
  local_d38[0] = ((byte)local_968 < (byte)local_998) * (byte)local_998 |
                 ((byte)local_968 >= (byte)local_998) * (byte)local_968;
  local_d38[2] = (local_968._2_1_ < local_998._2_1_) * local_998._2_1_ |
                 (local_968._2_1_ >= local_998._2_1_) * local_968._2_1_;
  local_d38[3] = (local_968._3_1_ < local_998._3_1_) * local_998._3_1_ |
                 (local_968._3_1_ >= local_998._3_1_) * local_968._3_1_;
  local_d38[4] = (local_968._4_1_ < local_998._4_1_) * local_998._4_1_ |
                 (local_968._4_1_ >= local_998._4_1_) * local_968._4_1_;
  local_d38[5] = (local_968._5_1_ < local_998._5_1_) * local_998._5_1_ |
                 (local_968._5_1_ >= local_998._5_1_) * local_968._5_1_;
  local_d38[6] = (local_968._6_1_ < local_998._6_1_) * local_998._6_1_ |
                 (local_968._6_1_ >= local_998._6_1_) * local_968._6_1_;
  local_d38[7] = (local_968._7_1_ < local_998._7_1_) * local_998._7_1_ |
                 (local_968._7_1_ >= local_998._7_1_) * local_968._7_1_;
  local_d38[8] = ((byte)uStack_960 < (byte)uStack_990) * (byte)uStack_990 |
                 ((byte)uStack_960 >= (byte)uStack_990) * (byte)uStack_960;
  local_d38[9] = (uStack_960._1_1_ < uStack_990._1_1_) * uStack_990._1_1_ |
                 (uStack_960._1_1_ >= uStack_990._1_1_) * uStack_960._1_1_;
  local_d38[10] =
       (uStack_960._2_1_ < uStack_990._2_1_) * uStack_990._2_1_ |
       (uStack_960._2_1_ >= uStack_990._2_1_) * uStack_960._2_1_;
  local_d38[0xb] =
       (uStack_960._3_1_ < uStack_990._3_1_) * uStack_990._3_1_ |
       (uStack_960._3_1_ >= uStack_990._3_1_) * uStack_960._3_1_;
  local_d38[0xc] =
       (uStack_960._4_1_ < uStack_990._4_1_) * uStack_990._4_1_ |
       (uStack_960._4_1_ >= uStack_990._4_1_) * uStack_960._4_1_;
  local_d38[0xd] =
       (uStack_960._5_1_ < uStack_990._5_1_) * uStack_990._5_1_ |
       (uStack_960._5_1_ >= uStack_990._5_1_) * uStack_960._5_1_;
  local_d38[0xe] =
       (uStack_960._6_1_ < uStack_990._6_1_) * uStack_990._6_1_ |
       (uStack_960._6_1_ >= uStack_990._6_1_) * uStack_960._6_1_;
  local_d38[0xf] =
       (uStack_960._7_1_ < uStack_990._7_1_) * uStack_990._7_1_ |
       (uStack_960._7_1_ >= uStack_990._7_1_) * uStack_960._7_1_;
  b_00[1] = uVar47;
  a_02[1] = in_RSI;
  a_02[0] = (longlong)a;
  local_e68 = auVar56;
  local_e58 = auVar55;
  local_c88 = uVar46;
  local_c78 = uVar3;
  local_c58 = local_c68;
  uStack_c50 = uStack_c60;
  local_a68 = uVar8;
  uStack_a60 = uVar9;
  local_a58 = uVar46;
  uStack_a50 = uVar10;
  local_a48 = uVar11;
  uStack_a40 = uVar12;
  local_998 = uVar54;
  uStack_990 = uVar71;
  local_978 = uVar13;
  uStack_970 = uVar14;
  local_968 = uVar15;
  uStack_960 = uVar16;
  local_8c8 = uVar53;
  uStack_8c0 = uVar70;
  abs_diff(a_02,b_00);
  puVar44 = local_cf0;
  local_9b8 = local_d38._0_8_;
  uVar10 = local_9b8;
  uStack_9b0 = local_d38._8_8_;
  uVar11 = uStack_9b0;
  local_9a8 = (byte)extraout_XMM0_Qa_07;
  bStack_9a7 = (byte)((ulong)extraout_XMM0_Qa_07 >> 8);
  bStack_9a6 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x10);
  bStack_9a5 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x18);
  bStack_9a4 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x20);
  bStack_9a3 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x28);
  bStack_9a2 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x30);
  bStack_9a1 = (byte)((ulong)extraout_XMM0_Qa_07 >> 0x38);
  bStack_9a0 = (byte)extraout_XMM0_Qb_01;
  bStack_99f = (byte)((ulong)extraout_XMM0_Qb_01 >> 8);
  bStack_99e = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x10);
  bStack_99d = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x18);
  bStack_99c = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x20);
  bStack_99b = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x28);
  bStack_99a = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x30);
  bStack_999 = (byte)((ulong)extraout_XMM0_Qb_01 >> 0x38);
  local_9b8._0_1_ = local_d38[0];
  local_9b8._1_1_ = local_d38[1];
  local_9b8._2_1_ = local_d38[2];
  local_9b8._3_1_ = local_d38[3];
  local_9b8._4_1_ = local_d38[4];
  local_9b8._5_1_ = local_d38[5];
  local_9b8._6_1_ = local_d38[6];
  local_9b8._7_1_ = local_d38[7];
  uStack_9b0._0_1_ = local_d38[8];
  uStack_9b0._1_1_ = local_d38[9];
  uStack_9b0._2_1_ = local_d38[10];
  uStack_9b0._3_1_ = local_d38[0xb];
  uStack_9b0._4_1_ = local_d38[0xc];
  uStack_9b0._5_1_ = local_d38[0xd];
  uStack_9b0._6_1_ = local_d38[0xe];
  uStack_9b0._7_1_ = local_d38[0xf];
  local_d38[0] = (local_9a8 < (byte)local_9b8) * (byte)local_9b8 |
                 (local_9a8 >= (byte)local_9b8) * local_9a8;
  local_d38[1] = (bStack_9a7 < local_9b8._1_1_) * local_9b8._1_1_ |
                 (bStack_9a7 >= local_9b8._1_1_) * bStack_9a7;
  local_d38[2] = (bStack_9a6 < local_9b8._2_1_) * local_9b8._2_1_ |
                 (bStack_9a6 >= local_9b8._2_1_) * bStack_9a6;
  local_d38[3] = (bStack_9a5 < local_9b8._3_1_) * local_9b8._3_1_ |
                 (bStack_9a5 >= local_9b8._3_1_) * bStack_9a5;
  local_d38[4] = (bStack_9a4 < local_9b8._4_1_) * local_9b8._4_1_ |
                 (bStack_9a4 >= local_9b8._4_1_) * bStack_9a4;
  local_d38[5] = (bStack_9a3 < local_9b8._5_1_) * local_9b8._5_1_ |
                 (bStack_9a3 >= local_9b8._5_1_) * bStack_9a3;
  local_d38[6] = (bStack_9a2 < local_9b8._6_1_) * local_9b8._6_1_ |
                 (bStack_9a2 >= local_9b8._6_1_) * bStack_9a2;
  local_d38[7] = (bStack_9a1 < local_9b8._7_1_) * local_9b8._7_1_ |
                 (bStack_9a1 >= local_9b8._7_1_) * bStack_9a1;
  local_d38[8] = (bStack_9a0 < (byte)uStack_9b0) * (byte)uStack_9b0 |
                 (bStack_9a0 >= (byte)uStack_9b0) * bStack_9a0;
  local_d38[9] = (bStack_99f < uStack_9b0._1_1_) * uStack_9b0._1_1_ |
                 (bStack_99f >= uStack_9b0._1_1_) * bStack_99f;
  local_d38[10] =
       (bStack_99e < uStack_9b0._2_1_) * uStack_9b0._2_1_ |
       (bStack_99e >= uStack_9b0._2_1_) * bStack_99e;
  local_d38[0xb] =
       (bStack_99d < uStack_9b0._3_1_) * uStack_9b0._3_1_ |
       (bStack_99d >= uStack_9b0._3_1_) * bStack_99d;
  local_d38[0xc] =
       (bStack_99c < uStack_9b0._4_1_) * uStack_9b0._4_1_ |
       (bStack_99c >= uStack_9b0._4_1_) * bStack_99c;
  local_d38[0xd] =
       (bStack_99b < uStack_9b0._5_1_) * uStack_9b0._5_1_ |
       (bStack_99b >= uStack_9b0._5_1_) * bStack_99b;
  local_d38[0xe] =
       (bStack_99a < uStack_9b0._6_1_) * uStack_9b0._6_1_ |
       (bStack_99a >= uStack_9b0._6_1_) * bStack_99a;
  local_d38[0xf] =
       (bStack_999 < uStack_9b0._7_1_) * uStack_9b0._7_1_ |
       (bStack_999 >= uStack_9b0._7_1_) * bStack_999;
  local_9d8 = local_d38 >> 0x20;
  local_9c8 = local_d38;
  local_d38[1] = (local_d38[1] < local_d38[5]) * local_d38[5] |
                 (local_d38[1] >= local_d38[5]) * local_d38[1];
  local_d38[0] = (local_d38[0] < local_d38[4]) * local_d38[4] |
                 (local_d38[0] >= local_d38[4]) * local_d38[0];
  local_d38[2] = (local_d38[2] < local_d38[6]) * local_d38[6] |
                 (local_d38[2] >= local_d38[6]) * local_d38[2];
  local_d38[3] = (local_d38[3] < local_d38[7]) * local_d38[7] |
                 (local_d38[3] >= local_d38[7]) * local_d38[3];
  local_d38[4] = (local_d38[4] < local_d38[8]) * local_d38[8] |
                 (local_d38[4] >= local_d38[8]) * local_d38[4];
  local_d38[5] = (local_d38[5] < local_d38[9]) * local_d38[9] |
                 (local_d38[5] >= local_d38[9]) * local_d38[5];
  local_d38[6] = (local_d38[6] < local_d38[10]) * local_d38[10] |
                 (local_d38[6] >= local_d38[10]) * local_d38[6];
  local_d38[7] = (local_d38[7] < local_d38[0xb]) * local_d38[0xb] |
                 (local_d38[7] >= local_d38[0xb]) * local_d38[7];
  local_d38[8] = (local_d38[8] < local_d38[0xc]) * local_d38[0xc] |
                 (local_d38[8] >= local_d38[0xc]) * local_d38[8];
  local_d38[9] = (local_d38[9] < local_d38[0xd]) * local_d38[0xd] |
                 (local_d38[9] >= local_d38[0xd]) * local_d38[9];
  local_d38[10] =
       (local_d38[10] < local_d38[0xe]) * local_d38[0xe] |
       (local_d38[10] >= local_d38[0xe]) * local_d38[10];
  local_d38[0xb] =
       (local_d38[0xb] < local_d38[0xf]) * local_d38[0xf] |
       (local_d38[0xb] >= local_d38[0xf]) * local_d38[0xb];
  local_818 = *(undefined8 *)*local_d08;
  uStack_810 = *(undefined8 *)(*local_d08 + 8);
  local_808 = local_d38._0_8_;
  uStack_800 = local_d38._8_8_;
  auVar30._8_8_ = local_d38._8_8_;
  auVar30._0_8_ = local_d38._0_8_;
  auVar55 = psubusb(auVar30,*local_d08);
  local_d38._0_8_ = auVar55._0_8_;
  local_d38._8_8_ = auVar55._8_8_;
  local_a88 = local_d38._0_8_;
  uVar8 = local_a88;
  uStack_a80 = local_d38._8_8_;
  uVar9 = uStack_a80;
  local_a98 = local_d28;
  uVar46 = local_a98;
  uStack_a90 = uStack_d20;
  uVar3 = uStack_a90;
  local_a88._0_1_ = auVar55[0];
  local_a88._1_1_ = auVar55[1];
  local_a88._2_1_ = auVar55[2];
  local_a88._3_1_ = auVar55[3];
  local_a88._4_1_ = auVar55[4];
  local_a88._5_1_ = auVar55[5];
  local_a88._6_1_ = auVar55[6];
  local_a88._7_1_ = auVar55[7];
  uStack_a80._0_1_ = auVar55[8];
  uStack_a80._1_1_ = auVar55[9];
  uStack_a80._2_1_ = auVar55[10];
  uStack_a80._3_1_ = auVar55[0xb];
  uStack_a80._4_1_ = auVar55[0xc];
  uStack_a80._5_1_ = auVar55[0xd];
  uStack_a80._6_1_ = auVar55[0xe];
  uStack_a80._7_1_ = auVar55[0xf];
  local_a98._0_1_ = (char)local_d28;
  local_a98._1_1_ = (char)((ulong)local_d28 >> 8);
  local_a98._2_1_ = (char)((ulong)local_d28 >> 0x10);
  local_a98._3_1_ = (char)((ulong)local_d28 >> 0x18);
  local_a98._4_1_ = (char)((ulong)local_d28 >> 0x20);
  local_a98._5_1_ = (char)((ulong)local_d28 >> 0x28);
  local_a98._6_1_ = (char)((ulong)local_d28 >> 0x30);
  local_a98._7_1_ = (char)((ulong)local_d28 >> 0x38);
  uStack_a90._0_1_ = (char)uStack_d20;
  uStack_a90._1_1_ = (char)((ulong)uStack_d20 >> 8);
  uStack_a90._2_1_ = (char)((ulong)uStack_d20 >> 0x10);
  uStack_a90._3_1_ = (char)((ulong)uStack_d20 >> 0x18);
  uStack_a90._4_1_ = (char)((ulong)uStack_d20 >> 0x20);
  uStack_a90._5_1_ = (char)((ulong)uStack_d20 >> 0x28);
  uStack_a90._6_1_ = (char)((ulong)uStack_d20 >> 0x30);
  uStack_a90._7_1_ = (char)((ulong)uStack_d20 >> 0x38);
  local_d38[1] = -(local_a88._1_1_ == local_a98._1_1_);
  local_d38[0] = -((char)local_a88 == (char)local_a98);
  local_d38[2] = -(local_a88._2_1_ == local_a98._2_1_);
  local_d38[3] = -(local_a88._3_1_ == local_a98._3_1_);
  local_d38[4] = -(local_a88._4_1_ == local_a98._4_1_);
  local_d38[5] = -(local_a88._5_1_ == local_a98._5_1_);
  local_d38[6] = -(local_a88._6_1_ == local_a98._6_1_);
  local_d38[7] = -(local_a88._7_1_ == local_a98._7_1_);
  local_d38[8] = -((char)uStack_a80 == (char)uStack_a90);
  local_d38[9] = -(uStack_a80._1_1_ == uStack_a90._1_1_);
  local_d38[10] = -(uStack_a80._2_1_ == uStack_a90._2_1_);
  local_d38[0xb] = -(uStack_a80._3_1_ == uStack_a90._3_1_);
  local_d38[0xc] = -(uStack_a80._4_1_ == uStack_a90._4_1_);
  local_d38[0xd] = -(uStack_a80._5_1_ == uStack_a90._5_1_);
  local_d38[0xe] = -(uStack_a80._6_1_ == uStack_a90._6_1_);
  local_d38[0xf] = -(uStack_a80._7_1_ == uStack_a90._7_1_);
  local_420 = local_cf8;
  local_428 = local_cf0;
  local_430 = &local_d48;
  local_440 = local_cf0;
  local_448 = local_cf8;
  local_e9 = 0;
  local_ea = 0;
  local_eb = 0;
  local_ec = 0;
  local_ed = 0;
  local_ee = 0;
  local_ef = 0;
  local_f0 = 0;
  local_f1 = 3;
  local_f2 = 3;
  local_f3 = 3;
  local_f4 = 3;
  local_f5 = 4;
  local_f6 = 4;
  local_f7 = 4;
  local_f8 = 4;
  local_4b8 = 0x303030304040404;
  uStack_4b0 = 0;
  local_369 = 0x80;
  local_109 = 0x80;
  local_10a = 0x80;
  local_10b = 0x80;
  local_10c = 0x80;
  local_10d = 0x80;
  local_10e = 0x80;
  local_10f = 0x80;
  local_110 = 0x80;
  local_111 = 0x80;
  local_112 = 0x80;
  local_113 = 0x80;
  local_114 = 0x80;
  local_115 = 0x80;
  local_116 = 0x80;
  local_117 = 0x80;
  local_118 = 0x80;
  local_4c8 = 0x8080808080808080;
  uStack_4c0 = 0x8080808080808080;
  local_4d8 = 0xff;
  uStack_4d7 = 0xff;
  uStack_4d6 = 0xff;
  uStack_4d5 = 0xff;
  uStack_4d4 = 0xff;
  uStack_4d3 = 0xff;
  uStack_4d2 = 0xff;
  uStack_4d1 = 0xff;
  uStack_4d0 = 0xff;
  uStack_4cf = 0xff;
  uStack_4ce = 0xff;
  uStack_4cd = 0xff;
  uStack_4cc = 0xff;
  uStack_4cb = 0xff;
  uStack_4ca = 0xff;
  uStack_4c9 = 0xff;
  local_298 = *local_cf8;
  uStack_290 = local_cf8[1];
  local_1d8 = local_298 ^ 0x8080808080808080;
  uStack_1d0 = uStack_290 ^ 0x8080808080808080;
  local_2b8 = *local_cf0;
  uStack_2b0 = local_cf0[1];
  local_278 = local_2b8 ^ 0x8080808080808080;
  uStack_270 = uStack_2b0 ^ 0x8080808080808080;
  auVar38._8_8_ = uStack_1d0;
  auVar38._0_8_ = local_1d8;
  auVar37._8_8_ = uStack_270;
  auVar37._0_8_ = local_278;
  local_478 = psubsb(auVar38,auVar37);
  local_328 = local_d48;
  uStack_320 = uStack_d40;
  local_318._0_8_ = local_478._4_8_;
  local_318._12_4_ = 0;
  local_318._8_4_ = local_478._12_4_;
  local_1f8 = local_318._0_8_ & local_d48;
  uStack_1f0 = local_318._8_8_ & uStack_d40;
  local_208 = local_478._0_8_;
  uStack_200 = local_478._8_8_;
  auVar36._8_8_ = uStack_1f0;
  auVar36._0_8_ = local_1f8;
  auVar55 = psubsb(auVar36,local_478);
  local_458 = auVar55._0_8_;
  uStack_450 = auVar55._8_8_;
  local_218 = local_458;
  uStack_210 = uStack_450;
  local_228 = local_478._0_8_;
  uStack_220 = local_478._8_8_;
  auVar55 = psubsb(auVar55,local_478);
  local_458 = auVar55._0_8_;
  uStack_450 = auVar55._8_8_;
  local_238 = local_458;
  uStack_230 = uStack_450;
  local_248 = local_478._0_8_;
  uStack_240 = local_478._8_8_;
  auVar55 = psubsb(auVar55,local_478);
  local_458 = auVar55._0_8_;
  uStack_450 = auVar55._8_8_;
  local_348 = local_d38._0_8_;
  uStack_340 = local_d38._8_8_;
  local_338 = local_458;
  uStack_330 = uStack_450;
  local_3d8 = local_458 & local_d38._0_8_;
  uStack_3d0 = uStack_450 & local_d38._8_8_;
  local_3c8._0_4_ = (undefined4)local_3d8;
  local_3c8._4_4_ = (undefined4)(local_3d8 >> 0x20);
  local_458 = CONCAT44((undefined4)local_3c8,(undefined4)local_3c8);
  uStack_450._0_4_ = local_3c8._4_4_;
  uStack_450._4_4_ = local_3c8._4_4_;
  local_198 = local_458;
  uStack_190 = uStack_450;
  auVar41._8_8_ = uStack_450;
  auVar41._0_8_ = local_458;
  auVar55 = paddsb(auVar41,ZEXT816(0x303030304040404));
  local_468 = auVar55._0_8_;
  uStack_460 = auVar55._8_8_;
  local_388 = local_468;
  uVar14 = local_388;
  uStack_380 = uStack_460;
  local_398 = local_468;
  uStack_390 = uStack_460;
  local_388._0_1_ = auVar55[0];
  local_388._1_1_ = auVar55[1];
  local_388._2_1_ = auVar55[2];
  local_388._3_1_ = auVar55[3];
  local_388._4_1_ = auVar55[4];
  local_388._5_1_ = auVar55[5];
  local_388._6_1_ = auVar55[6];
  local_388._7_1_ = auVar55[7];
  local_468._0_2_ = CONCAT11((undefined1)local_388,(undefined1)local_388);
  local_468._0_3_ = CONCAT12(local_388._1_1_,(undefined2)local_468);
  local_468._0_4_ = CONCAT13(local_388._1_1_,(undefined3)local_468);
  local_468._0_5_ = CONCAT14(local_388._2_1_,(undefined4)local_468);
  local_468._0_6_ = CONCAT15(local_388._2_1_,(undefined5)local_468);
  local_468._0_7_ = CONCAT16(local_388._3_1_,(undefined6)local_468);
  local_468 = CONCAT17(local_388._3_1_,(undefined7)local_468);
  uStack_460._0_1_ = local_388._4_1_;
  uStack_460._1_1_ = local_388._4_1_;
  uStack_460._2_1_ = local_388._5_1_;
  uStack_460._3_1_ = local_388._5_1_;
  uStack_460._4_1_ = local_388._6_1_;
  uStack_460._5_1_ = local_388._6_1_;
  uStack_460._6_1_ = local_388._7_1_;
  uStack_460._7_1_ = local_388._7_1_;
  local_78 = local_468;
  uStack_70 = uStack_460;
  local_7c = 0xb;
  auVar43._8_8_ = uStack_460;
  auVar43._0_8_ = local_468;
  auVar55 = psraw(auVar43,ZEXT416(0xb));
  local_468 = auVar55._0_8_;
  uStack_460 = auVar55._8_8_;
  local_138 = local_468;
  uStack_130 = uStack_460;
  local_148 = local_468;
  uStack_140 = uStack_460;
  auVar55 = packsswb(auVar55,auVar55);
  local_468 = auVar55._0_8_;
  uStack_460 = auVar55._8_8_;
  local_268 = 0xffffffffffffffff;
  uStack_260 = 0xffffffffffffffff;
  local_258 = local_468;
  uStack_250 = uStack_460;
  auVar35._8_8_ = 0xffffffffffffffff;
  auVar35._0_8_ = 0xffffffffffffffff;
  auVar57 = psubsb(auVar55,auVar35);
  local_458 = auVar57._0_8_;
  uStack_450 = auVar57._8_8_;
  local_3a8 = local_458;
  uVar13 = local_3a8;
  uStack_3a0 = uStack_450;
  local_3b8 = local_458;
  uStack_3b0 = uStack_450;
  local_3a8._0_1_ = auVar57[0];
  local_3a8._1_1_ = auVar57[1];
  local_3a8._2_1_ = auVar57[2];
  local_3a8._3_1_ = auVar57[3];
  local_3a8._4_1_ = auVar57[4];
  local_3a8._5_1_ = auVar57[5];
  local_3a8._6_1_ = auVar57[6];
  local_3a8._7_1_ = auVar57[7];
  local_458._0_2_ = CONCAT11((undefined1)local_3a8,(undefined1)local_3a8);
  local_458._0_3_ = CONCAT12(local_3a8._1_1_,(undefined2)local_458);
  local_458._0_4_ = CONCAT13(local_3a8._1_1_,(undefined3)local_458);
  local_458._0_5_ = CONCAT14(local_3a8._2_1_,(undefined4)local_458);
  local_458._0_6_ = CONCAT15(local_3a8._2_1_,(undefined5)local_458);
  local_458._0_7_ = CONCAT16(local_3a8._3_1_,(undefined6)local_458);
  local_458 = CONCAT17(local_3a8._3_1_,(undefined7)local_458);
  uStack_450._0_1_ = local_3a8._4_1_;
  uStack_450._1_1_ = local_3a8._4_1_;
  uStack_450._2_1_ = local_3a8._5_1_;
  uStack_450._3_1_ = local_3a8._5_1_;
  uStack_450._4_1_ = local_3a8._6_1_;
  uStack_450._5_1_ = local_3a8._6_1_;
  uStack_450._6_1_ = local_3a8._7_1_;
  uStack_450._7_1_ = local_3a8._7_1_;
  local_98 = local_458;
  uStack_90 = uStack_450;
  local_9c = 9;
  auVar42._8_8_ = uStack_450;
  auVar42._0_8_ = local_458;
  auVar57 = psraw(auVar42,ZEXT416(9));
  local_458 = auVar57._0_8_;
  uStack_450 = auVar57._8_8_;
  local_158 = local_458;
  uStack_150 = uStack_450;
  local_168 = local_458;
  uStack_160 = uStack_450;
  auVar57 = packsswb(auVar57,auVar57);
  local_178 = local_d48;
  uStack_170 = uStack_d40;
  local_458 = auVar57._0_8_;
  uStack_450 = auVar57._8_8_;
  local_188 = local_458;
  uStack_180 = uStack_450;
  local_3f8 = ~local_d48 & local_458;
  uStack_3f0 = ~uStack_d40 & uStack_450;
  local_3e8._0_4_ = (undefined4)local_3f8;
  local_3e8._4_4_ = (undefined4)(local_3f8 >> 0x20);
  local_458 = CONCAT44((undefined4)local_3e8,(undefined4)local_3e8);
  uStack_450._0_4_ = local_3e8._4_4_;
  uStack_450._4_4_ = local_3e8._4_4_;
  local_408 = local_468;
  uVar12 = local_408;
  uStack_400 = uStack_460;
  local_418 = local_458;
  uStack_410 = uStack_450;
  local_408._0_4_ = auVar55._0_4_;
  local_408._4_4_ = auVar55._4_4_;
  local_468 = CONCAT44((undefined4)local_3e8,(undefined4)local_408);
  uStack_460._0_4_ = local_408._4_4_;
  uStack_460._4_4_ = (undefined4)local_3e8;
  local_4a8 = uStack_460;
  uStack_4a0 = 0;
  local_288 = local_468;
  uStack_280 = uStack_460;
  auVar34._8_8_ = uStack_270;
  auVar34._0_8_ = local_278;
  auVar33._8_8_ = uStack_460;
  auVar33._0_8_ = local_468;
  local_498 = psubsb(auVar34,auVar33);
  local_1c8 = uStack_460;
  uStack_1c0 = 0;
  auVar40._8_8_ = uStack_1d0;
  auVar40._0_8_ = local_1d8;
  auVar39._8_8_ = 0;
  auVar39._0_8_ = uStack_460;
  local_488 = paddsb(auVar40,auVar39);
  local_2d8 = local_498._0_8_;
  uStack_2d0 = local_498._8_8_;
  uVar47 = local_498._8_8_ ^ 0x8080808080808080;
  local_a98 = uVar46;
  uStack_a90 = uVar3;
  local_a88 = uVar8;
  uStack_a80 = uVar9;
  local_9b8 = uVar10;
  uStack_9b0 = uVar11;
  local_438 = local_d38;
  local_408 = uVar12;
  local_3e8 = local_3f8;
  uStack_3e0 = uStack_3f0;
  local_3c8 = local_3d8;
  uStack_3c0 = uStack_3d0;
  local_3a8 = uVar13;
  local_388 = uVar14;
  local_368 = local_4c8;
  uStack_360 = uStack_4c0;
  local_358 = local_4c8;
  uStack_350 = uStack_4c0;
  local_318 = local_478 >> 0x20;
  local_2e8 = local_4c8;
  uStack_2e0 = uStack_4c0;
  local_2c8 = local_4c8;
  uStack_2c0 = uStack_4c0;
  local_2a8 = local_4c8;
  uStack_2a0 = uStack_4c0;
  local_1e8 = local_278;
  uStack_1e0 = uStack_270;
  local_1b8 = local_1d8;
  uStack_1b0 = uStack_1d0;
  local_1a8 = local_4b8;
  uStack_1a0 = uStack_4b0;
  local_128 = local_4c8;
  uStack_120 = uStack_4c0;
  local_108 = local_4b8;
  uStack_100 = uStack_4b0;
  *local_cf0 = local_498._0_8_ ^ 0x8080808080808080;
  puVar44[1] = uVar47;
  puVar45 = local_448;
  local_2f8 = local_488._0_8_;
  uStack_2f0 = local_488._8_8_;
  local_308 = local_4c8;
  uStack_300 = uStack_4c0;
  uVar47 = local_488._8_8_ ^ uStack_4c0;
  *local_448 = local_488._0_8_ ^ local_4c8;
  puVar45[1] = uVar47;
  b_01[1] = (longlong)puVar44;
  b_01[0] = (longlong)local_d38;
  a_03[1] = in_RSI;
  a_03[0] = (longlong)a;
  alVar72 = abs_diff(a_03,b_01);
  puVar44 = local_cf0;
  v[1] = alVar72[1];
  local_9f8 = local_e88;
  uVar10 = local_9f8;
  uStack_9f0 = uStack_e80;
  uVar11 = uStack_9f0;
  local_9e8 = (byte)extraout_XMM0_Qa_08;
  bStack_9e7 = (byte)((ulong)extraout_XMM0_Qa_08 >> 8);
  bStack_9e6 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x10);
  bStack_9e5 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x18);
  bStack_9e4 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x20);
  bStack_9e3 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x28);
  bStack_9e2 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x30);
  bStack_9e1 = (byte)((ulong)extraout_XMM0_Qa_08 >> 0x38);
  bStack_9e0 = (byte)extraout_XMM0_Qb_02;
  bStack_9df = (byte)((ulong)extraout_XMM0_Qb_02 >> 8);
  bStack_9de = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x10);
  bStack_9dd = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x18);
  bStack_9dc = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x20);
  bStack_9db = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x28);
  bStack_9da = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x30);
  bStack_9d9 = (byte)((ulong)extraout_XMM0_Qb_02 >> 0x38);
  local_9f8._0_1_ = (byte)local_e88;
  local_9f8._1_1_ = (byte)((ulong)local_e88 >> 8);
  local_9f8._2_1_ = (byte)((ulong)local_e88 >> 0x10);
  local_9f8._3_1_ = (byte)((ulong)local_e88 >> 0x18);
  local_9f8._4_1_ = (byte)((ulong)local_e88 >> 0x20);
  local_9f8._5_1_ = (byte)((ulong)local_e88 >> 0x28);
  local_9f8._6_1_ = (byte)((ulong)local_e88 >> 0x30);
  local_9f8._7_1_ = (byte)((ulong)local_e88 >> 0x38);
  uStack_9f0._0_1_ = (byte)uStack_e80;
  uStack_9f0._1_1_ = (byte)((ulong)uStack_e80 >> 8);
  uStack_9f0._2_1_ = (byte)((ulong)uStack_e80 >> 0x10);
  uStack_9f0._3_1_ = (byte)((ulong)uStack_e80 >> 0x18);
  uStack_9f0._4_1_ = (byte)((ulong)uStack_e80 >> 0x20);
  uStack_9f0._5_1_ = (byte)((ulong)uStack_e80 >> 0x28);
  uStack_9f0._6_1_ = (byte)((ulong)uStack_e80 >> 0x30);
  uStack_9f0._7_1_ = (byte)((ulong)uStack_e80 >> 0x38);
  local_d58[0] = (local_9e8 < (byte)local_9f8) * (byte)local_9f8 |
                 (local_9e8 >= (byte)local_9f8) * local_9e8;
  local_d58[1] = (bStack_9e7 < local_9f8._1_1_) * local_9f8._1_1_ |
                 (bStack_9e7 >= local_9f8._1_1_) * bStack_9e7;
  local_d58[2] = (bStack_9e6 < local_9f8._2_1_) * local_9f8._2_1_ |
                 (bStack_9e6 >= local_9f8._2_1_) * bStack_9e6;
  local_d58[3] = (bStack_9e5 < local_9f8._3_1_) * local_9f8._3_1_ |
                 (bStack_9e5 >= local_9f8._3_1_) * bStack_9e5;
  local_d58[4] = (bStack_9e4 < local_9f8._4_1_) * local_9f8._4_1_ |
                 (bStack_9e4 >= local_9f8._4_1_) * bStack_9e4;
  local_d58[5] = (bStack_9e3 < local_9f8._5_1_) * local_9f8._5_1_ |
                 (bStack_9e3 >= local_9f8._5_1_) * bStack_9e3;
  local_d58[6] = (bStack_9e2 < local_9f8._6_1_) * local_9f8._6_1_ |
                 (bStack_9e2 >= local_9f8._6_1_) * bStack_9e2;
  local_d58[7] = (bStack_9e1 < local_9f8._7_1_) * local_9f8._7_1_ |
                 (bStack_9e1 >= local_9f8._7_1_) * bStack_9e1;
  local_d58[8] = (bStack_9e0 < (byte)uStack_9f0) * (byte)uStack_9f0 |
                 (bStack_9e0 >= (byte)uStack_9f0) * bStack_9e0;
  local_d58[9] = (bStack_9df < uStack_9f0._1_1_) * uStack_9f0._1_1_ |
                 (bStack_9df >= uStack_9f0._1_1_) * bStack_9df;
  local_d58[10] =
       (bStack_9de < uStack_9f0._2_1_) * uStack_9f0._2_1_ |
       (bStack_9de >= uStack_9f0._2_1_) * bStack_9de;
  local_d58[0xb] =
       (bStack_9dd < uStack_9f0._3_1_) * uStack_9f0._3_1_ |
       (bStack_9dd >= uStack_9f0._3_1_) * bStack_9dd;
  local_d58[0xc] =
       (bStack_9dc < uStack_9f0._4_1_) * uStack_9f0._4_1_ |
       (bStack_9dc >= uStack_9f0._4_1_) * bStack_9dc;
  local_d58[0xd] =
       (bStack_9db < uStack_9f0._5_1_) * uStack_9f0._5_1_ |
       (bStack_9db >= uStack_9f0._5_1_) * bStack_9db;
  local_d58[0xe] =
       (bStack_9da < uStack_9f0._6_1_) * uStack_9f0._6_1_ |
       (bStack_9da >= uStack_9f0._6_1_) * bStack_9da;
  local_d58[0xf] =
       (bStack_9d9 < uStack_9f0._7_1_) * uStack_9f0._7_1_ |
       (bStack_9d9 >= uStack_9f0._7_1_) * bStack_9d9;
  local_a18 = local_d58 >> 0x20;
  local_a08 = local_d58;
  local_d58[1] = (local_d58[1] < local_d58[5]) * local_d58[5] |
                 (local_d58[1] >= local_d58[5]) * local_d58[1];
  local_d58[0] = (local_d58[0] < local_d58[4]) * local_d58[4] |
                 (local_d58[0] >= local_d58[4]) * local_d58[0];
  local_d58[2] = (local_d58[2] < local_d58[6]) * local_d58[6] |
                 (local_d58[2] >= local_d58[6]) * local_d58[2];
  local_d58[3] = (local_d58[3] < local_d58[7]) * local_d58[7] |
                 (local_d58[3] >= local_d58[7]) * local_d58[3];
  local_d58[4] = (local_d58[4] < local_d58[8]) * local_d58[8] |
                 (local_d58[4] >= local_d58[8]) * local_d58[4];
  local_d58[5] = (local_d58[5] < local_d58[9]) * local_d58[9] |
                 (local_d58[5] >= local_d58[9]) * local_d58[5];
  local_d58[6] = (local_d58[6] < local_d58[10]) * local_d58[10] |
                 (local_d58[6] >= local_d58[10]) * local_d58[6];
  local_d58[7] = (local_d58[7] < local_d58[0xb]) * local_d58[0xb] |
                 (local_d58[7] >= local_d58[0xb]) * local_d58[7];
  local_d58[8] = (local_d58[8] < local_d58[0xc]) * local_d58[0xc] |
                 (local_d58[8] >= local_d58[0xc]) * local_d58[8];
  local_d58[9] = (local_d58[9] < local_d58[0xd]) * local_d58[0xd] |
                 (local_d58[9] >= local_d58[0xd]) * local_d58[9];
  local_d58[10] =
       (local_d58[10] < local_d58[0xe]) * local_d58[0xe] |
       (local_d58[10] >= local_d58[0xe]) * local_d58[10];
  local_d58[0xb] =
       (local_d58[0xb] < local_d58[0xf]) * local_d58[0xf] |
       (local_d58[0xb] >= local_d58[0xf]) * local_d58[0xb];
  local_828 = local_d58._0_8_;
  uStack_820 = local_d58._8_8_;
  local_838 = local_e28;
  uStack_830 = uStack_e20;
  auVar29._8_8_ = local_d58._8_8_;
  auVar29._0_8_ = local_d58._0_8_;
  auVar28._8_8_ = uStack_e20;
  auVar28._0_8_ = local_e28;
  auVar55 = psubusb(auVar29,auVar28);
  local_d58._0_8_ = auVar55._0_8_;
  local_d58._8_8_ = auVar55._8_8_;
  local_aa8 = local_d58._0_8_;
  uVar8 = local_aa8;
  uStack_aa0 = local_d58._8_8_;
  uVar9 = uStack_aa0;
  local_ab8 = local_d28;
  uVar46 = local_ab8;
  uStack_ab0 = uStack_d20;
  uVar3 = uStack_ab0;
  local_aa8._0_1_ = auVar55[0];
  local_aa8._1_1_ = auVar55[1];
  local_aa8._2_1_ = auVar55[2];
  local_aa8._3_1_ = auVar55[3];
  local_aa8._4_1_ = auVar55[4];
  local_aa8._5_1_ = auVar55[5];
  local_aa8._6_1_ = auVar55[6];
  local_aa8._7_1_ = auVar55[7];
  uStack_aa0._0_1_ = auVar55[8];
  uStack_aa0._1_1_ = auVar55[9];
  uStack_aa0._2_1_ = auVar55[10];
  uStack_aa0._3_1_ = auVar55[0xb];
  uStack_aa0._4_1_ = auVar55[0xc];
  uStack_aa0._5_1_ = auVar55[0xd];
  uStack_aa0._6_1_ = auVar55[0xe];
  uStack_aa0._7_1_ = auVar55[0xf];
  local_ab8._0_1_ = (char)local_d28;
  local_ab8._1_1_ = (char)((ulong)local_d28 >> 8);
  local_ab8._2_1_ = (char)((ulong)local_d28 >> 0x10);
  local_ab8._3_1_ = (char)((ulong)local_d28 >> 0x18);
  local_ab8._4_1_ = (char)((ulong)local_d28 >> 0x20);
  local_ab8._5_1_ = (char)((ulong)local_d28 >> 0x28);
  local_ab8._6_1_ = (char)((ulong)local_d28 >> 0x30);
  local_ab8._7_1_ = (char)((ulong)local_d28 >> 0x38);
  uStack_ab0._0_1_ = (char)uStack_d20;
  uStack_ab0._1_1_ = (char)((ulong)uStack_d20 >> 8);
  uStack_ab0._2_1_ = (char)((ulong)uStack_d20 >> 0x10);
  uStack_ab0._3_1_ = (char)((ulong)uStack_d20 >> 0x18);
  uStack_ab0._4_1_ = (char)((ulong)uStack_d20 >> 0x20);
  uStack_ab0._5_1_ = (char)((ulong)uStack_d20 >> 0x28);
  uStack_ab0._6_1_ = (char)((ulong)uStack_d20 >> 0x30);
  uStack_ab0._7_1_ = (char)((ulong)uStack_d20 >> 0x38);
  local_d58[1] = -(local_aa8._1_1_ == local_ab8._1_1_);
  local_d58[0] = -((char)local_aa8 == (char)local_ab8);
  local_d58[2] = -(local_aa8._2_1_ == local_ab8._2_1_);
  local_d58[3] = -(local_aa8._3_1_ == local_ab8._3_1_);
  local_d58[4] = -(local_aa8._4_1_ == local_ab8._4_1_);
  local_d58[5] = -(local_aa8._5_1_ == local_ab8._5_1_);
  local_d58[6] = -(local_aa8._6_1_ == local_ab8._6_1_);
  local_d58[7] = -(local_aa8._7_1_ == local_ab8._7_1_);
  local_d58[8] = -((char)uStack_aa0 == (char)uStack_ab0);
  local_d58[9] = -(uStack_aa0._1_1_ == uStack_ab0._1_1_);
  local_d58[10] = -(uStack_aa0._2_1_ == uStack_ab0._2_1_);
  local_d58[0xb] = -(uStack_aa0._3_1_ == uStack_ab0._3_1_);
  local_d58[0xc] = -(uStack_aa0._4_1_ == uStack_ab0._4_1_);
  local_d58[0xd] = -(uStack_aa0._5_1_ == uStack_ab0._5_1_);
  local_d58[0xe] = -(uStack_aa0._6_1_ == uStack_ab0._6_1_);
  local_d58[0xf] = -(uStack_aa0._7_1_ == uStack_ab0._7_1_);
  local_868 = local_d58._0_8_;
  uStack_860 = local_d58._8_8_;
  local_878 = local_d38._0_8_;
  uStack_870 = local_d38._8_8_;
  local_ca8 = local_d58._0_8_ & local_d38._0_8_;
  uStack_ca0 = local_d58._8_8_ & local_d38._8_8_;
  local_c98._0_4_ = (undefined4)local_ca8;
  local_c98._4_4_ = (undefined4)(local_ca8 >> 0x20);
  local_d58._4_4_ = (undefined4)local_c98;
  local_d58._0_4_ = (undefined4)local_c98;
  local_d58._8_4_ = local_c98._4_4_;
  local_d58._12_4_ = local_c98._4_4_;
  local_af8 = local_d58._0_8_;
  uStack_af0 = local_d58._8_8_;
  local_b08 = local_d58._0_8_;
  uStack_b00 = local_d58._8_8_;
  local_d58._8_8_ = local_d58._0_8_;
  local_ac8 = local_d58._0_8_;
  uVar47 = local_ac8;
  uStack_ac0 = local_d58._0_8_;
  local_ad8 = local_d28;
  uStack_ad0 = uStack_d20;
  local_ac8._0_1_ = (char)local_ca8;
  local_ac8._1_1_ = (char)(local_ca8 >> 8);
  local_ac8._2_1_ = (char)(local_ca8 >> 0x10);
  local_ac8._3_1_ = (char)(local_ca8 >> 0x18);
  local_778 = -((char)local_ac8 == (char)local_ab8);
  cStack_777 = -(local_ac8._1_1_ == local_ab8._1_1_);
  cStack_776 = -(local_ac8._2_1_ == local_ab8._2_1_);
  cStack_775 = -(local_ac8._3_1_ == local_ab8._3_1_);
  cStack_774 = -((char)local_ac8 == local_ab8._4_1_);
  cStack_773 = -(local_ac8._1_1_ == local_ab8._5_1_);
  cStack_772 = -(local_ac8._2_1_ == local_ab8._6_1_);
  cStack_771 = -(local_ac8._3_1_ == local_ab8._7_1_);
  cStack_770 = -((char)local_ac8 == (char)uStack_ab0);
  cStack_76f = -(local_ac8._1_1_ == uStack_ab0._1_1_);
  cStack_76e = -(local_ac8._2_1_ == uStack_ab0._2_1_);
  cStack_76d = -(local_ac8._3_1_ == uStack_ab0._3_1_);
  cStack_76c = -((char)local_ac8 == uStack_ab0._4_1_);
  cStack_76b = -(local_ac8._1_1_ == uStack_ab0._5_1_);
  cStack_76a = -(local_ac8._2_1_ == uStack_ab0._6_1_);
  bStack_769 = -(local_ac8._3_1_ == uStack_ab0._7_1_);
  auVar32[1] = cStack_777;
  auVar32[0] = local_778;
  auVar32[2] = cStack_776;
  auVar32[3] = cStack_775;
  auVar32[4] = cStack_774;
  auVar32[5] = cStack_773;
  auVar32[6] = cStack_772;
  auVar32[7] = cStack_771;
  auVar32[8] = cStack_770;
  auVar32[9] = cStack_76f;
  auVar32[10] = cStack_76e;
  auVar32[0xb] = cStack_76d;
  auVar32[0xc] = cStack_76c;
  auVar32[0xd] = cStack_76b;
  auVar32[0xe] = cStack_76a;
  auVar32[0xf] = bStack_769;
  local_c98 = local_ca8;
  uStack_c90 = uStack_ca0;
  local_ac8 = uVar47;
  uStack_ab0 = uVar3;
  local_aa8 = uVar8;
  uStack_aa0 = uVar9;
  local_9f8 = uVar10;
  uStack_9f0 = uVar11;
  if ((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) | (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
               (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe | (ushort)(bStack_769 >> 7) << 0xf) !=
      0xffff) {
    local_6da = 4;
    local_2 = 4;
    local_4 = 4;
    local_6 = 4;
    local_8 = 4;
    local_a = 4;
    local_c = 4;
    local_e = 4;
    local_10 = 4;
    local_ea8 = 0x4000400040004;
    uStack_ea0 = 0x4000400040004;
    uStack_b50 = CONCAT44(uStack_d5c,uStack_d60);
    local_b68 = local_d28;
    uStack_b60 = uStack_d20;
    local_b58._0_1_ = (undefined1)local_d68;
    local_b58._1_1_ = (undefined1)((uint)local_d68 >> 8);
    local_b58._2_1_ = (undefined1)((uint)local_d68 >> 0x10);
    local_b58._3_1_ = (undefined1)((uint)local_d68 >> 0x18);
    local_b58._4_1_ = (undefined1)uStack_d64;
    local_b58._5_1_ = (undefined1)((uint)uStack_d64 >> 8);
    local_b58._6_1_ = (undefined1)((uint)uStack_d64 >> 0x10);
    local_b58._7_1_ = (undefined1)((uint)uStack_d64 >> 0x18);
    local_db8 = (undefined1)local_b58;
    cStack_db7 = (char)local_ab8;
    uStack_db6 = local_b58._1_1_;
    cStack_db5 = local_ab8._1_1_;
    uStack_db4 = local_b58._2_1_;
    cStack_db3 = local_ab8._2_1_;
    uStack_db2 = local_b58._3_1_;
    cStack_db1 = local_ab8._3_1_;
    uStack_db0 = local_b58._4_1_;
    cStack_daf = local_ab8._4_1_;
    uStack_dae = local_b58._5_1_;
    cStack_dad = local_ab8._5_1_;
    uStack_dac = local_b58._6_1_;
    cStack_dab = local_ab8._6_1_;
    uStack_daa = local_b58._7_1_;
    cStack_da9 = local_ab8._7_1_;
    uStack_b70 = CONCAT44(uStack_d6c,uStack_d70);
    local_b88 = local_d28;
    uStack_b80 = uStack_d20;
    local_b78._0_1_ = (undefined1)local_d78;
    local_b78._1_1_ = (undefined1)((uint)local_d78 >> 8);
    local_b78._2_1_ = (undefined1)((uint)local_d78 >> 0x10);
    local_b78._3_1_ = (undefined1)((uint)local_d78 >> 0x18);
    local_b78._4_1_ = (undefined1)uStack_d74;
    local_b78._5_1_ = (undefined1)((uint)uStack_d74 >> 8);
    local_b78._6_1_ = (undefined1)((uint)uStack_d74 >> 0x10);
    local_b78._7_1_ = (undefined1)((uint)uStack_d74 >> 0x18);
    local_dd8 = (undefined1)local_b78;
    cStack_dd7 = (char)local_ab8;
    uStack_dd6 = local_b78._1_1_;
    cStack_dd5 = local_ab8._1_1_;
    uStack_dd4 = local_b78._2_1_;
    cStack_dd3 = local_ab8._2_1_;
    uStack_dd2 = local_b78._3_1_;
    cStack_dd1 = local_ab8._3_1_;
    uStack_dd0 = local_b78._4_1_;
    cStack_dcf = local_ab8._4_1_;
    uStack_dce = local_b78._5_1_;
    cStack_dcd = local_ab8._5_1_;
    uStack_dcc = local_b78._6_1_;
    cStack_dcb = local_ab8._6_1_;
    uStack_dca = local_b78._7_1_;
    cStack_dc9 = local_ab8._7_1_;
    uStack_b90 = CONCAT44(uStack_d7c,uStack_d80);
    local_ba8 = local_d28;
    uStack_ba0 = uStack_d20;
    local_b98._0_1_ = (undefined1)local_d88;
    local_b98._1_1_ = (undefined1)((uint)local_d88 >> 8);
    local_b98._2_1_ = (undefined1)((uint)local_d88 >> 0x10);
    local_b98._3_1_ = (undefined1)((uint)local_d88 >> 0x18);
    local_b98._4_1_ = (undefined1)uStack_d84;
    local_b98._5_1_ = (undefined1)((uint)uStack_d84 >> 8);
    local_b98._6_1_ = (undefined1)((uint)uStack_d84 >> 0x10);
    local_b98._7_1_ = (undefined1)((uint)uStack_d84 >> 0x18);
    local_de8 = (undefined1)local_b98;
    cStack_de7 = (char)local_ab8;
    uStack_de6 = local_b98._1_1_;
    cStack_de5 = local_ab8._1_1_;
    uStack_de4 = local_b98._2_1_;
    cStack_de3 = local_ab8._2_1_;
    uStack_de2 = local_b98._3_1_;
    cStack_de1 = local_ab8._3_1_;
    uStack_de0 = local_b98._4_1_;
    cStack_ddf = local_ab8._4_1_;
    uStack_dde = local_b98._5_1_;
    cStack_ddd = local_ab8._5_1_;
    uStack_ddc = local_b98._6_1_;
    cStack_ddb = local_ab8._6_1_;
    uStack_dda = local_b98._7_1_;
    cStack_dd9 = local_ab8._7_1_;
    uVar4 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b98._5_1_,CONCAT11(local_ab8._4_1_,local_b98._4_1_)));
    uVar5 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b98._6_1_,uVar4));
    local_df8 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b98._7_1_,uVar5));
    uStack_df0 = 0;
    uVar21 = CONCAT13(local_ab8._5_1_,
                      CONCAT12(local_b58._5_1_,CONCAT11(local_ab8._4_1_,local_b58._4_1_)));
    uVar22 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b58._6_1_,uVar21));
    local_dc8 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b58._7_1_,uVar22));
    uStack_dc0 = 0;
    uVar1 = CONCAT13(local_ab8._1_1_,
                     CONCAT12(local_b98._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b98)));
    uVar2 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b98._2_1_,uVar1));
    local_578 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b98._3_1_,uVar2));
    uVar6 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b98._5_1_,CONCAT11(local_ab8._4_1_,local_b98._4_1_)));
    uVar7 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b98._6_1_,uVar6));
    uStack_570 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b98._7_1_,uVar7));
    local_568._2_2_ = (short)((uint)uVar1 >> 0x10);
    local_568._4_2_ = (short)((uint6)uVar2 >> 0x20);
    local_568._6_2_ = (short)((ulong)local_578 >> 0x30);
    uStack_560._2_2_ = (short)((uint)uVar6 >> 0x10);
    uStack_560._4_2_ = (short)((uint6)uVar7 >> 0x20);
    uStack_560._6_2_ = (short)((ulong)uStack_570 >> 0x30);
    local_588 = CONCAT11((char)local_ab8,(undefined1)local_b98) * 2;
    sStack_586 = local_568._2_2_ * 2;
    sStack_584 = local_568._4_2_ * 2;
    sStack_582 = local_568._6_2_ * 2;
    sStack_580 = CONCAT11(local_ab8._4_1_,local_b98._4_1_) * 2;
    sStack_57e = uStack_560._2_2_ * 2;
    sStack_57c = uStack_560._4_2_ * 2;
    sStack_57a = uStack_560._6_2_ * 2;
    uVar1 = CONCAT13(local_ab8._1_1_,
                     CONCAT12(local_b78._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b78)));
    uVar2 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b78._2_1_,uVar1));
    uVar9 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b78._3_1_,uVar2));
    uVar6 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b78._5_1_,CONCAT11(local_ab8._4_1_,local_b78._4_1_)));
    uVar7 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b78._6_1_,uVar6));
    uVar13 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b78._7_1_,uVar7));
    local_598._2_2_ = (short)((uint)uVar1 >> 0x10);
    local_598._4_2_ = (short)((uint6)uVar2 >> 0x20);
    local_598._6_2_ = (short)((ulong)uVar9 >> 0x30);
    uStack_590._2_2_ = (short)((uint)uVar6 >> 0x10);
    uStack_590._4_2_ = (short)((uint6)uVar7 >> 0x20);
    uStack_590._6_2_ = (short)((ulong)uVar13 >> 0x30);
    local_ee8 = local_588 + CONCAT11((char)local_ab8,(undefined1)local_b78);
    sStack_ee6 = sStack_586 + local_598._2_2_;
    sStack_ee4 = sStack_584 + local_598._4_2_;
    sStack_ee2 = sStack_582 + local_598._6_2_;
    sStack_ee0 = sStack_580 + CONCAT11(local_ab8._4_1_,local_b78._4_1_);
    sStack_ede = sStack_57e + uStack_590._2_2_;
    sStack_edc = sStack_57c + uStack_590._4_2_;
    sStack_eda = sStack_57a + uStack_590._6_2_;
    uVar1 = CONCAT13(local_ab8._1_1_,
                     CONCAT12(local_b78._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b78)));
    uVar2 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b78._2_1_,uVar1));
    uVar10 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b78._3_1_,uVar2));
    uVar6 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b78._5_1_,CONCAT11(local_ab8._4_1_,local_b78._4_1_)));
    uVar7 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b78._6_1_,uVar6));
    uVar14 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b78._7_1_,uVar7));
    uVar18 = CONCAT13(local_ab8._1_1_,
                      CONCAT12(local_b58._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b58)));
    uVar19 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b58._2_1_,uVar18));
    uVar17 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b58._3_1_,uVar19));
    uVar24 = CONCAT13(local_ab8._5_1_,
                      CONCAT12(local_b58._5_1_,CONCAT11(local_ab8._4_1_,local_b58._4_1_)));
    uVar25 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b58._6_1_,uVar24));
    uVar23 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b58._7_1_,uVar25));
    local_5a8._2_2_ = (short)((uint)uVar1 >> 0x10);
    local_5a8._4_2_ = (short)((uint6)uVar2 >> 0x20);
    local_5a8._6_2_ = (short)((ulong)uVar10 >> 0x30);
    uStack_5a0._2_2_ = (short)((uint)uVar6 >> 0x10);
    uStack_5a0._4_2_ = (short)((uint6)uVar7 >> 0x20);
    uStack_5a0._6_2_ = (short)((ulong)uVar14 >> 0x30);
    local_5b8._2_2_ = (short)((uint)uVar18 >> 0x10);
    local_5b8._4_2_ = (short)((uint6)uVar19 >> 0x20);
    local_5b8._6_2_ = (short)((ulong)uVar17 >> 0x30);
    uStack_5b0._2_2_ = (short)((uint)uVar24 >> 0x10);
    uStack_5b0._4_2_ = (short)((uint6)uVar25 >> 0x20);
    uStack_5b0._6_2_ = (short)((ulong)uVar23 >> 0x30);
    local_ef8 = CONCAT11((char)local_ab8,(undefined1)local_b78) +
                CONCAT11((char)local_ab8,(undefined1)local_b58);
    sStack_ef6 = local_5a8._2_2_ + local_5b8._2_2_;
    sStack_ef4 = local_5a8._4_2_ + local_5b8._4_2_;
    sStack_ef2 = local_5a8._6_2_ + local_5b8._6_2_;
    sStack_ef0 = CONCAT11(local_ab8._4_1_,local_b78._4_1_) +
                 CONCAT11(local_ab8._4_1_,local_b58._4_1_);
    sStack_eee = uStack_5a0._2_2_ + uStack_5b0._2_2_;
    sStack_eec = uStack_5a0._4_2_ + uStack_5b0._4_2_;
    sStack_eea = uStack_5a0._6_2_ + uStack_5b0._6_2_;
    local_5c8 = CONCAT26(sStack_ee2,CONCAT24(sStack_ee4,CONCAT22(sStack_ee6,local_ee8)));
    uStack_5c0 = CONCAT26(sStack_eda,CONCAT24(sStack_edc,CONCAT22(sStack_ede,sStack_ee0)));
    local_5e8 = local_ee8 + 4;
    sStack_5e6 = sStack_ee6 + 4;
    sStack_5e4 = sStack_ee4 + 4;
    sStack_5e2 = sStack_ee2 + 4;
    sStack_5e0 = sStack_ee0 + 4;
    sStack_5de = sStack_ede + 4;
    sStack_5dc = sStack_edc + 4;
    sStack_5da = sStack_eda + 4;
    local_5f8 = CONCAT26(sStack_ef2,CONCAT24(sStack_ef4,CONCAT22(sStack_ef6,local_ef8)));
    uStack_5f0 = CONCAT26(sStack_eea,CONCAT24(sStack_eec,CONCAT22(sStack_eee,sStack_ef0)));
    sVar48 = local_5e8 + local_ef8;
    sVar58 = sStack_5e6 + sStack_ef6;
    sVar62 = sStack_5e4 + sStack_ef4;
    sVar66 = sStack_5e2 + sStack_ef2;
    sStack_500 = sStack_5e0 + sStack_ef0;
    sStack_4fe = sStack_5de + sStack_eee;
    sStack_4fc = sStack_5dc + sStack_eec;
    sStack_4fa = sStack_5da + sStack_eea;
    local_eb8._0_4_ = CONCAT22(sVar58,sVar48);
    local_eb8._0_6_ = CONCAT24(sVar62,(undefined4)local_eb8);
    local_eb8 = CONCAT26(sVar66,(undefined6)local_eb8);
    uStack_eb0._0_4_ = CONCAT22(sStack_4fe,sStack_500);
    uStack_eb0._0_6_ = CONCAT24(sStack_4fc,(undefined4)uStack_eb0);
    uStack_eb0 = CONCAT26(sStack_4fa,(undefined6)uStack_eb0);
    uVar1 = CONCAT13(local_ab8._1_1_,
                     CONCAT12(local_b58._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b58)));
    uVar2 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b58._2_1_,uVar1));
    local_618 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b58._3_1_,uVar2));
    uVar6 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b58._5_1_,CONCAT11(local_ab8._4_1_,local_b58._4_1_)));
    uVar7 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b58._6_1_,uVar6));
    uStack_610 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b58._7_1_,uVar7));
    local_608._2_2_ = (short)((uint)uVar1 >> 0x10);
    local_608._4_2_ = (short)((uint6)uVar2 >> 0x20);
    local_608._6_2_ = (short)((ulong)local_618 >> 0x30);
    uStack_600._2_2_ = (short)((uint)uVar6 >> 0x10);
    uStack_600._4_2_ = (short)((uint6)uVar7 >> 0x20);
    uStack_600._6_2_ = (short)((ulong)uStack_610 >> 0x30);
    local_628 = CONCAT11((char)local_ab8,(undefined1)local_b58) * 2;
    sStack_626 = local_608._2_2_ * 2;
    sStack_624 = local_608._4_2_ * 2;
    sStack_622 = local_608._6_2_ * 2;
    sStack_620 = CONCAT11(local_ab8._4_1_,local_b58._4_1_) * 2;
    sStack_61e = uStack_600._2_2_ * 2;
    sStack_61c = uStack_600._4_2_ * 2;
    sStack_61a = uStack_600._6_2_ * 2;
    uStack_630 = 0;
    local_638._2_2_ = (short)((uint)uVar4 >> 0x10);
    local_638._4_2_ = (short)((uint6)uVar5 >> 0x20);
    local_638._6_2_ = (short)((ulong)local_df8 >> 0x30);
    sVar49 = local_628 + CONCAT11(local_ab8._4_1_,local_b98._4_1_);
    local_ec8._0_4_ = CONCAT22(sStack_626 + local_638._2_2_,sVar49);
    local_ec8._0_6_ = CONCAT24(sStack_624 + local_638._4_2_,(undefined4)local_ec8);
    local_ec8 = CONCAT26(sStack_622 + local_638._6_2_,(undefined6)local_ec8);
    uStack_ec0._0_4_ = CONCAT22(sStack_61e,sStack_620);
    uStack_ec0._0_6_ = CONCAT24(sStack_61c,(undefined4)uStack_ec0);
    uStack_ec0 = CONCAT26(sStack_61a,(undefined6)uStack_ec0);
    local_648 = local_eb8;
    uStack_640 = uStack_eb0;
    local_658 = local_ec8;
    uStack_650 = uStack_ec0;
    uVar50 = sVar48 + sVar49;
    uVar59 = sVar58 + sStack_626 + local_638._2_2_;
    uVar63 = sVar62 + sStack_624 + local_638._4_2_;
    uVar67 = sVar66 + sStack_622 + local_638._6_2_;
    local_ec8._0_4_ = CONCAT22(uVar59,uVar50);
    local_ec8._0_6_ = CONCAT24(uVar63,(undefined4)local_ec8);
    local_ec8 = CONCAT26(uVar67,(undefined6)local_ec8);
    uStack_ec0._0_4_ = CONCAT22(sStack_4fe + sStack_61e,sStack_500 + sStack_620);
    uStack_ec0._0_6_ = CONCAT24(sStack_4fc + sStack_61c,(undefined4)uStack_ec0);
    uStack_ec0 = CONCAT26(sStack_4fa + sStack_61a,(undefined6)uStack_ec0);
    local_678 = CONCAT26(sStack_eda,CONCAT24(sStack_edc,CONCAT22(sStack_ede,sStack_ee0)));
    local_668 = local_eb8;
    uStack_660 = uStack_eb0;
    uStack_670 = 0;
    uVar51 = sVar48 + sStack_ee0;
    uVar60 = sVar58 + sStack_ede;
    uVar64 = sVar62 + sStack_edc;
    uVar68 = sVar66 + sStack_eda;
    local_eb8._0_4_ = CONCAT22(uVar60,uVar51);
    local_eb8._0_6_ = CONCAT24(uVar64,(undefined4)local_eb8);
    local_eb8 = CONCAT26(uVar68,(undefined6)local_eb8);
    uStack_eb0._0_4_ = CONCAT22(sStack_4fe,sStack_500);
    uStack_eb0._0_6_ = CONCAT24(sStack_4fc,(undefined4)uStack_eb0);
    uStack_eb0 = CONCAT26(sStack_4fa,(undefined6)uStack_eb0);
    local_b18 = local_eb8;
    uStack_b10 = uStack_eb0;
    local_b28 = local_ec8;
    uStack_b20 = uStack_ec0;
    local_8e8 = local_eb8;
    uStack_8e0 = local_ec8;
    local_8ec = 3;
    uVar52 = uVar51 >> 3;
    uVar61 = uVar60 >> 3;
    uVar65 = uVar64 >> 3;
    uVar69 = uVar68 >> 3;
    uVar50 = uVar50 >> 3;
    uVar59 = uVar59 >> 3;
    uVar63 = uVar63 >> 3;
    uVar67 = uVar67 >> 3;
    local_ec8._0_4_ = CONCAT22(uVar61,uVar52);
    local_ec8._0_6_ = CONCAT24(uVar65,(undefined4)local_ec8);
    local_ec8 = CONCAT26(uVar69,(undefined6)local_ec8);
    uStack_ec0._0_4_ = CONCAT22(uVar59,uVar50);
    uStack_ec0._0_6_ = CONCAT24(uVar63,(undefined4)uStack_ec0);
    uStack_ec0 = CONCAT26(uVar67,(undefined6)uStack_ec0);
    local_38 = local_ec8;
    uStack_30 = uStack_ec0;
    local_48 = local_ec8;
    uStack_40 = uStack_ec0;
    local_d98 = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
    cStack_d97 = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
    cStack_d96 = (uVar65 != 0) * (uVar65 < 0x100) * (char)uVar65 - (0xff < uVar65);
    cStack_d95 = (uVar69 != 0) * (uVar69 < 0x100) * (char)uVar69 - (0xff < uVar69);
    cStack_d94 = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
    cStack_d93 = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
    cStack_d92 = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
    cStack_d91 = (uVar67 != 0) * (uVar67 < 0x100) * (char)uVar67 - (0xff < uVar67);
    cStack_d90 = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
    cStack_d8f = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
    cStack_d8e = (uVar65 != 0) * (uVar65 < 0x100) * (char)uVar65 - (0xff < uVar65);
    cStack_d8d = (uVar69 != 0) * (uVar69 < 0x100) * (char)uVar69 - (0xff < uVar69);
    cStack_d8c = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
    cStack_d8b = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
    cStack_d8a = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
    cStack_d89 = (uVar67 != 0) * (uVar67 < 0x100) * (char)uVar67 - (0xff < uVar67);
    uVar1 = CONCAT13(local_ab8._1_1_,
                     CONCAT12(local_b58._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b58)));
    uVar2 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b58._2_1_,uVar1));
    uVar20 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b58._3_1_,uVar2));
    uVar4 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b58._5_1_,CONCAT11(local_ab8._4_1_,local_b58._4_1_)));
    uVar5 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b58._6_1_,uVar4));
    uVar26 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b58._7_1_,uVar5));
    local_4e8 = local_eb8;
    uStack_4e0 = uStack_eb0;
    local_4f8._2_2_ = (short)((uint)uVar1 >> 0x10);
    local_4f8._4_2_ = (short)((uint6)uVar2 >> 0x20);
    local_4f8._6_2_ = (short)((ulong)uVar20 >> 0x30);
    uStack_4f0._2_2_ = (short)((uint)uVar4 >> 0x10);
    uStack_4f0._4_2_ = (short)((uint6)uVar5 >> 0x20);
    uStack_4f0._6_2_ = (short)((ulong)uVar26 >> 0x30);
    local_508 = uVar51 - CONCAT11((char)local_ab8,(undefined1)local_b58);
    sStack_506 = uVar60 - local_4f8._2_2_;
    sStack_504 = uVar64 - local_4f8._4_2_;
    sStack_502 = uVar68 - local_4f8._6_2_;
    sStack_500 = sStack_500 - CONCAT11(local_ab8._4_1_,local_b58._4_1_);
    sStack_4fe = sStack_4fe - uStack_4f0._2_2_;
    sStack_4fc = sStack_4fc - uStack_4f0._4_2_;
    sStack_4fa = sStack_4fa - uStack_4f0._6_2_;
    uVar1 = CONCAT13(local_ab8._1_1_,
                     CONCAT12(local_b78._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b78)));
    uVar2 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b78._2_1_,uVar1));
    uVar11 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b78._3_1_,uVar2));
    uVar4 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b78._5_1_,CONCAT11(local_ab8._4_1_,local_b78._4_1_)));
    uVar5 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b78._6_1_,uVar4));
    uVar15 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b78._7_1_,uVar5));
    local_518._2_2_ = (short)((uint)uVar1 >> 0x10);
    local_518._4_2_ = (short)((uint6)uVar2 >> 0x20);
    local_518._6_2_ = (short)((ulong)uVar11 >> 0x30);
    uStack_510._2_2_ = (short)((uint)uVar4 >> 0x10);
    uStack_510._4_2_ = (short)((uint6)uVar5 >> 0x20);
    uStack_510._6_2_ = (short)((ulong)uVar15 >> 0x30);
    sVar48 = local_508 - CONCAT11((char)local_ab8,(undefined1)local_b78);
    sStack_540 = sStack_500 - CONCAT11(local_ab8._4_1_,local_b78._4_1_);
    uStack_510._2_2_ = sStack_4fe - uStack_510._2_2_;
    uStack_510._4_2_ = sStack_4fc - uStack_510._4_2_;
    uStack_510._6_2_ = sStack_4fa - uStack_510._6_2_;
    local_eb8._0_4_ = CONCAT22(sStack_506 - local_518._2_2_,sVar48);
    local_eb8._0_6_ = CONCAT24(sStack_504 - local_518._4_2_,(undefined4)local_eb8);
    local_eb8 = CONCAT26(sStack_502 - local_518._6_2_,(undefined6)local_eb8);
    uStack_eb0._0_4_ = CONCAT22(uStack_510._2_2_,sStack_540);
    uStack_eb0._0_6_ = CONCAT24(uStack_510._4_2_,(undefined4)uStack_eb0);
    uStack_eb0 = CONCAT26(uStack_510._6_2_,(undefined6)uStack_eb0);
    local_698 = CONCAT26(sStack_eea,CONCAT24(sStack_eec,CONCAT22(sStack_eee,sStack_ef0)));
    local_688 = local_eb8;
    uStack_680 = uStack_eb0;
    uStack_690 = 0;
    uVar51 = sVar48 + sStack_ef0;
    uVar59 = (sStack_506 - local_518._2_2_) + sStack_eee;
    uVar61 = (sStack_504 - local_518._4_2_) + sStack_eec;
    uVar64 = (sStack_502 - local_518._6_2_) + sStack_eea;
    local_eb8._0_4_ = CONCAT22(uVar59,uVar51);
    local_eb8._0_6_ = CONCAT24(uVar61,(undefined4)local_eb8);
    local_eb8 = CONCAT26(uVar64,(undefined6)local_eb8);
    uStack_eb0._0_4_ = CONCAT22(uStack_510._2_2_,sStack_540);
    uStack_eb0._0_6_ = CONCAT24(uStack_510._4_2_,(undefined4)uStack_eb0);
    uStack_eb0 = CONCAT26(uStack_510._6_2_,(undefined6)uStack_eb0);
    uVar1 = CONCAT13(local_ab8._1_1_,
                     CONCAT12(local_b78._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b78)));
    uVar2 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b78._2_1_,uVar1));
    uVar12 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b78._3_1_,uVar2));
    uVar4 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b78._5_1_,CONCAT11(local_ab8._4_1_,local_b78._4_1_)));
    uVar5 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b78._6_1_,uVar4));
    uVar16 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b78._7_1_,uVar5));
    local_528 = local_eb8;
    uStack_520 = uStack_eb0;
    local_538._2_2_ = (short)((uint)uVar1 >> 0x10);
    local_538._4_2_ = (short)((uint6)uVar2 >> 0x20);
    local_538._6_2_ = (short)((ulong)uVar12 >> 0x30);
    uStack_530._2_2_ = (short)((uint)uVar4 >> 0x10);
    uStack_530._4_2_ = (short)((uint6)uVar5 >> 0x20);
    uStack_530._6_2_ = (short)((ulong)uVar16 >> 0x30);
    local_548 = uVar51 - CONCAT11((char)local_ab8,(undefined1)local_b78);
    sStack_546 = uVar59 - local_538._2_2_;
    sStack_544 = uVar61 - local_538._4_2_;
    sStack_542 = uVar64 - local_538._6_2_;
    sStack_540 = sStack_540 - CONCAT11(local_ab8._4_1_,local_b78._4_1_);
    sStack_53e = uStack_510._2_2_ - uStack_530._2_2_;
    sStack_53c = uStack_510._4_2_ - uStack_530._4_2_;
    sStack_53a = uStack_510._6_2_ - uStack_530._6_2_;
    uVar1 = CONCAT13(local_ab8._1_1_,
                     CONCAT12(local_b98._1_1_,CONCAT11((char)local_ab8,(undefined1)local_b98)));
    uVar2 = CONCAT15(local_ab8._2_1_,CONCAT14(local_b98._2_1_,uVar1));
    uVar3 = CONCAT17(local_ab8._3_1_,CONCAT16(local_b98._3_1_,uVar2));
    uVar4 = CONCAT13(local_ab8._5_1_,
                     CONCAT12(local_b98._5_1_,CONCAT11(local_ab8._4_1_,local_b98._4_1_)));
    uVar5 = CONCAT15(local_ab8._6_1_,CONCAT14(local_b98._6_1_,uVar4));
    uVar8 = CONCAT17(local_ab8._7_1_,CONCAT16(local_b98._7_1_,uVar5));
    local_558._2_2_ = (short)((uint)uVar1 >> 0x10);
    local_558._4_2_ = (short)((uint6)uVar2 >> 0x20);
    local_558._6_2_ = (short)((ulong)uVar3 >> 0x30);
    uStack_550._2_2_ = (short)((uint)uVar4 >> 0x10);
    uStack_550._4_2_ = (short)((uint6)uVar5 >> 0x20);
    uStack_550._6_2_ = (short)((ulong)uVar8 >> 0x30);
    sVar49 = local_548 - CONCAT11((char)local_ab8,(undefined1)local_b98);
    sVar58 = sStack_540 - CONCAT11(local_ab8._4_1_,local_b98._4_1_);
    local_ed8 = CONCAT26(sStack_542 - local_558._6_2_,
                         CONCAT24(sStack_544 - local_558._4_2_,
                                  CONCAT22(sStack_546 - local_558._2_2_,sVar49)));
    uStack_ed0 = CONCAT26(sStack_53a - uStack_550._6_2_,
                          CONCAT24(sStack_53c - uStack_550._4_2_,
                                   CONCAT22(sStack_53e - uStack_550._2_2_,sVar58)));
    uStack_6a0 = 0;
    uStack_6b0 = 0;
    local_6a8._2_2_ = (short)((uint)uVar21 >> 0x10);
    local_6a8._4_2_ = (short)((uint6)uVar22 >> 0x20);
    local_6a8._6_2_ = (short)((ulong)local_dc8 >> 0x30);
    sVar48 = CONCAT11(local_ab8._4_1_,local_b58._4_1_) * 2;
    local_ec8._0_4_ = CONCAT22(local_6a8._2_2_ * 2,sVar48);
    local_ec8._0_6_ = CONCAT24(local_6a8._4_2_ * 2,(undefined4)local_ec8);
    local_ec8 = CONCAT26(local_6a8._6_2_ * 2,(undefined6)local_ec8);
    local_6c8 = local_ed8;
    uStack_6c0 = uStack_ed0;
    local_6d8 = local_ec8;
    uStack_6d0 = 0;
    uVar50 = sVar49 + sVar48;
    uVar52 = (sStack_546 - local_558._2_2_) + local_6a8._2_2_ * 2;
    uVar60 = (sStack_544 - local_558._4_2_) + local_6a8._4_2_ * 2;
    uVar63 = (sStack_542 - local_558._6_2_) + local_6a8._6_2_ * 2;
    local_ec8._0_4_ = CONCAT22(uVar52,uVar50);
    local_ec8._0_6_ = CONCAT24(uVar60,(undefined4)local_ec8);
    local_ec8 = CONCAT26(uVar63,(undefined6)local_ec8);
    uStack_ec0._0_4_ = CONCAT22(sStack_53e - uStack_550._2_2_,sVar58);
    uStack_ec0._0_6_ = CONCAT24(sStack_53c - uStack_550._4_2_,(undefined4)uStack_ec0);
    uStack_ec0 = CONCAT26(sStack_53a - uStack_550._6_2_,(undefined6)uStack_ec0);
    local_b38 = local_eb8;
    uStack_b30 = uStack_eb0;
    local_b48 = local_ec8;
    uStack_b40 = uStack_ec0;
    local_908 = local_eb8;
    uStack_900 = local_ec8;
    local_90c = 3;
    uVar51 = uVar51 >> 3;
    uVar59 = uVar59 >> 3;
    uVar61 = uVar61 >> 3;
    uVar64 = uVar64 >> 3;
    uVar50 = uVar50 >> 3;
    uVar52 = uVar52 >> 3;
    uVar60 = uVar60 >> 3;
    uVar63 = uVar63 >> 3;
    local_eb8._0_4_ = CONCAT22(uVar59,uVar51);
    local_eb8._0_6_ = CONCAT24(uVar61,(undefined4)local_eb8);
    local_eb8 = CONCAT26(uVar64,(undefined6)local_eb8);
    uStack_eb0._0_4_ = CONCAT22(uVar52,uVar50);
    uStack_eb0._0_6_ = CONCAT24(uVar60,(undefined4)uStack_eb0);
    uStack_eb0 = CONCAT26(uVar63,(undefined6)uStack_eb0);
    local_58 = local_eb8;
    uStack_50 = uStack_eb0;
    local_68 = local_eb8;
    uStack_60 = uStack_eb0;
    local_da8 = (uVar51 != 0) * (uVar51 < 0x100) * (char)uVar51 - (0xff < uVar51);
    cStack_da7 = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
    cStack_da6 = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
    cStack_da5 = (uVar64 != 0) * (uVar64 < 0x100) * (char)uVar64 - (0xff < uVar64);
    cStack_da4 = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
    cStack_da3 = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
    cStack_da2 = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
    cStack_da1 = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
    cStack_da0 = (uVar51 != 0) * (uVar51 < 0x100) * (char)uVar51 - (0xff < uVar51);
    cStack_d9f = (uVar59 != 0) * (uVar59 < 0x100) * (char)uVar59 - (0xff < uVar59);
    cStack_d9e = (uVar61 != 0) * (uVar61 < 0x100) * (char)uVar61 - (0xff < uVar61);
    cStack_d9d = (uVar64 != 0) * (uVar64 < 0x100) * (char)uVar64 - (0xff < uVar64);
    cStack_d9c = (uVar50 != 0) * (uVar50 < 0x100) * (char)uVar50 - (0xff < uVar50);
    cStack_d9b = (uVar52 != 0) * (uVar52 < 0x100) * (char)uVar52 - (0xff < uVar52);
    cStack_d9a = (uVar60 != 0) * (uVar60 < 0x100) * (char)uVar60 - (0xff < uVar60);
    cStack_d99 = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
    local_708 = *local_cf0;
    uStack_700 = local_cf0[1];
    local_6f8 = local_d58._0_8_;
    uStack_6f0 = local_d58._0_8_;
    local_e18 = ~local_d58._0_8_ & local_708;
    uStack_e10 = ~local_d58._0_8_ & uStack_700;
    local_898 = CONCAT17(cStack_da1,
                         CONCAT16(cStack_da2,
                                  CONCAT15(cStack_da3,
                                           CONCAT14(cStack_da4,
                                                    CONCAT13(cStack_da5,
                                                             CONCAT12(cStack_da6,
                                                                      CONCAT11(cStack_da7,local_da8)
                                                                     ))))));
    uStack_890 = CONCAT17(cStack_d99,
                          CONCAT16(cStack_d9a,
                                   CONCAT15(cStack_d9b,
                                            CONCAT14(cStack_d9c,
                                                     CONCAT13(cStack_d9d,
                                                              CONCAT12(cStack_d9e,
                                                                       CONCAT11(cStack_d9f,
                                                                                cStack_da0)))))));
    local_888 = local_d58._0_8_;
    uStack_880 = local_d58._0_8_;
    uVar47 = local_d58._0_8_ & uStack_890;
    local_b98 = CONCAT44(uStack_d84,local_d88);
    local_b78 = CONCAT44(uStack_d74,local_d78);
    local_b58 = CONCAT44(uStack_d64,local_d68);
    local_ab8 = uVar46;
    local_6b8 = local_dc8;
    local_6a8 = local_dc8;
    local_638 = local_df8;
    local_608 = local_618;
    uStack_600 = uStack_610;
    local_5d8 = local_ea8;
    uStack_5d0 = uStack_ea0;
    local_5b8 = uVar17;
    uStack_5b0 = uVar23;
    local_5a8 = uVar10;
    uStack_5a0 = uVar14;
    local_598 = uVar9;
    uStack_590 = uVar13;
    local_568 = local_578;
    uStack_560 = uStack_570;
    local_558 = uVar3;
    uStack_550 = uVar8;
    local_538 = uVar12;
    uStack_530 = uVar16;
    local_518 = uVar11;
    uStack_510 = uVar15;
    local_4f8 = uVar20;
    uStack_4f0 = uVar26;
    local_28 = local_ea8;
    uStack_20 = uStack_ea0;
    *local_cf0 = local_d58._0_8_ & local_898;
    puVar44[1] = uVar47;
    puVar44 = local_cf0;
    local_748 = *local_cf0;
    uStack_740 = local_cf0[1];
    local_738 = local_e18;
    uStack_730 = uStack_e10;
    uVar47 = uStack_e10 | uStack_740;
    *local_cf0 = local_e18 | local_748;
    puVar44[1] = uVar47;
    puVar44 = local_cf8;
    uVar47 = *local_cf8;
    uVar53 = local_cf8[1];
    local_718 = local_d58._0_8_;
    uVar54 = local_718;
    uStack_710 = local_d58._8_8_;
    uVar70 = uStack_710;
    local_718._0_4_ = (uint)local_d58._0_8_;
    local_718._4_4_ = SUB84(local_d58._0_8_,4);
    uStack_710._0_4_ = (uint)local_d58._8_8_;
    uStack_710._4_4_ = SUB84(local_d58._8_8_,4);
    local_728._0_4_ = (uint)uVar47;
    local_728._4_4_ = (uint)(uVar47 >> 0x20);
    uStack_720._0_4_ = (uint)uVar53;
    uStack_720._4_4_ = (uint)(uVar53 >> 0x20);
    local_e08 = ((uint)local_718 ^ 0xffffffff) & (uint)local_728;
    uStack_e04 = (local_718._4_4_ ^ 0xffffffff) & local_728._4_4_;
    uStack_e00 = ((uint)uStack_710 ^ 0xffffffff) & (uint)uStack_720;
    uStack_dfc = (uStack_710._4_4_ ^ 0xffffffff) & uStack_720._4_4_;
    local_8b8 = CONCAT17(cStack_d91,
                         CONCAT16(cStack_d92,
                                  CONCAT15(cStack_d93,
                                           CONCAT14(cStack_d94,
                                                    CONCAT13(cStack_d95,
                                                             CONCAT12(cStack_d96,
                                                                      CONCAT11(cStack_d97,local_d98)
                                                                     ))))));
    uStack_8b0 = CONCAT17(cStack_d89,
                          CONCAT16(cStack_d8a,
                                   CONCAT15(cStack_d8b,
                                            CONCAT14(cStack_d8c,
                                                     CONCAT13(cStack_d8d,
                                                              CONCAT12(cStack_d8e,
                                                                       CONCAT11(cStack_d8f,
                                                                                cStack_d90)))))));
    local_8a8 = local_d58._0_8_;
    uStack_8a0 = local_d58._8_8_;
    uVar71 = local_d58._8_8_ & uStack_8b0;
    local_728 = uVar47;
    uStack_720 = uVar53;
    local_718 = uVar54;
    uStack_710 = uVar70;
    *local_cf8 = local_d58._0_8_ & local_8b8;
    puVar44[1] = uVar71;
    puVar44 = local_cf8;
    local_758 = CONCAT44(uStack_e04,local_e08);
    uStack_750 = CONCAT44(uStack_dfc,uStack_e00);
    local_768 = *local_cf8;
    uStack_760 = local_cf8[1];
    uVar47 = uStack_750 | uStack_760;
    *local_cf8 = local_758 | local_768;
    puVar44[1] = uVar47;
    uVar46 = local_ab8;
  }
  local_ab8 = uVar46;
  v[0] = in_RSI;
  xx_storel_32((void *)((long)local_f18 - (long)local_f1c),v);
  v_00[1] = extraout_RDX;
  v_00[0] = in_RSI;
  xx_storel_32((void *)((long)local_f18 - (long)(local_f1c * 2)),v_00);
  v_01[1] = extraout_RDX_00;
  v_01[0] = in_RSI;
  xx_storel_32(local_f18,v_01);
  v_02[1] = extraout_RDX_01;
  v_02[0] = in_RSI;
  xx_storel_32((void *)((long)local_f18 + (long)local_f1c),v_02);
  return;
}

Assistant:

void aom_lpf_horizontal_6_sse2(unsigned char *s, int p,
                               const unsigned char *_blimit,
                               const unsigned char *_limit,
                               const unsigned char *_thresh) {
  __m128i p2, p1, p0, q0, q1, q2;
  __m128i p1p0, q1q0;
  __m128i blimit = _mm_load_si128((__m128i *)_blimit);
  __m128i limit = _mm_load_si128((__m128i *)_limit);
  __m128i thresh = _mm_load_si128((__m128i *)_thresh);

  p2 = xx_loadl_32(s - 3 * p);
  p1 = xx_loadl_32(s - 2 * p);
  p0 = xx_loadl_32(s - 1 * p);
  q0 = xx_loadl_32(s - 0 * p);
  q1 = xx_loadl_32(s + 1 * p);
  q2 = xx_loadl_32(s + 2 * p);

  lpf_internal_6_sse2(&p2, &q2, &p1, &q1, &p0, &q0, &q1q0, &p1p0, &blimit,
                      &limit, &thresh);

  xx_storel_32(s - 1 * p, p1p0);
  xx_storel_32(s - 2 * p, _mm_srli_si128(p1p0, 4));
  xx_storel_32(s + 0 * p, q1q0);
  xx_storel_32(s + 1 * p, _mm_srli_si128(q1q0, 4));
}